

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [32];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  byte bVar48;
  byte bVar49;
  byte bVar50;
  ulong uVar51;
  ulong uVar52;
  long lVar53;
  byte bVar54;
  byte bVar55;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  bool bVar56;
  byte bVar57;
  uint uVar58;
  undefined1 uVar59;
  bool bVar60;
  undefined1 uVar61;
  ulong uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar135;
  uint uVar136;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  uint uVar137;
  uint uVar141;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  float pp;
  float fVar142;
  undefined4 uVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar219 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 extraout_var [60];
  undefined1 auVar157 [64];
  float fVar158;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar166 [32];
  undefined1 auVar159 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar202;
  float fVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar241;
  undefined1 auVar240 [32];
  undefined1 auVar242 [32];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_cb4;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 extraout_var_00 [60];
  
  PVar2 = prim[1];
  uVar51 = (ulong)(byte)PVar2;
  fVar203 = *(float *)(prim + uVar51 * 0x19 + 0x12);
  auVar67 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar71 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar74 = vsubps_avx(auVar67,*(undefined1 (*) [16])(prim + uVar51 * 0x19 + 6));
  fVar202 = fVar203 * auVar74._0_4_;
  fVar142 = fVar203 * auVar71._0_4_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar51 * 4 + 6);
  auVar83 = vpmovsxbd_avx2(auVar67);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar51 * 5 + 6);
  auVar81 = vpmovsxbd_avx2(auVar13);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar51 * 6 + 6);
  auVar15 = vpmovsxbd_avx2(auVar65);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar51 * 0xb + 6);
  auVar84 = vpmovsxbd_avx2(auVar1);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar89 = vpmovsxbd_avx2(auVar68);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vcvtdq2ps_avx(auVar89);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar51 + 6);
  auVar82 = vpmovsxbd_avx2(auVar73);
  auVar82 = vcvtdq2ps_avx(auVar82);
  uVar52 = (ulong)(uint)((int)(uVar51 * 9) * 2);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar52 + 6);
  auVar86 = vpmovsxbd_avx2(auVar69);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar52 + uVar51 + 6);
  auVar87 = vpmovsxbd_avx2(auVar66);
  auVar87 = vcvtdq2ps_avx(auVar87);
  uVar62 = (ulong)(uint)((int)(uVar51 * 5) << 2);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar62 + 6);
  auVar80 = vpmovsxbd_avx2(auVar70);
  auVar88 = vcvtdq2ps_avx(auVar80);
  auVar99._4_4_ = fVar142;
  auVar99._0_4_ = fVar142;
  auVar99._8_4_ = fVar142;
  auVar99._12_4_ = fVar142;
  auVar99._16_4_ = fVar142;
  auVar99._20_4_ = fVar142;
  auVar99._24_4_ = fVar142;
  auVar99._28_4_ = fVar142;
  auVar101._8_4_ = 1;
  auVar101._0_8_ = 0x100000001;
  auVar101._12_4_ = 1;
  auVar101._16_4_ = 1;
  auVar101._20_4_ = 1;
  auVar101._24_4_ = 1;
  auVar101._28_4_ = 1;
  auVar78 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar91 = ZEXT1632(CONCAT412(fVar203 * auVar71._12_4_,
                               CONCAT48(fVar203 * auVar71._8_4_,
                                        CONCAT44(fVar203 * auVar71._4_4_,fVar142))));
  auVar90 = vpermps_avx2(auVar101,auVar91);
  auVar79 = vpermps_avx512vl(auVar78,auVar91);
  fVar142 = auVar79._0_4_;
  fVar158 = auVar79._4_4_;
  auVar91._4_4_ = fVar158 * auVar15._4_4_;
  auVar91._0_4_ = fVar142 * auVar15._0_4_;
  fVar170 = auVar79._8_4_;
  auVar91._8_4_ = fVar170 * auVar15._8_4_;
  fVar171 = auVar79._12_4_;
  auVar91._12_4_ = fVar171 * auVar15._12_4_;
  fVar172 = auVar79._16_4_;
  auVar91._16_4_ = fVar172 * auVar15._16_4_;
  fVar174 = auVar79._20_4_;
  auVar91._20_4_ = fVar174 * auVar15._20_4_;
  fVar173 = auVar79._24_4_;
  auVar91._24_4_ = fVar173 * auVar15._24_4_;
  auVar91._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar82._4_4_ * fVar158;
  auVar89._0_4_ = auVar82._0_4_ * fVar142;
  auVar89._8_4_ = auVar82._8_4_ * fVar170;
  auVar89._12_4_ = auVar82._12_4_ * fVar171;
  auVar89._16_4_ = auVar82._16_4_ * fVar172;
  auVar89._20_4_ = auVar82._20_4_ * fVar174;
  auVar89._24_4_ = auVar82._24_4_ * fVar173;
  auVar89._28_4_ = auVar80._28_4_;
  auVar80._4_4_ = auVar88._4_4_ * fVar158;
  auVar80._0_4_ = auVar88._0_4_ * fVar142;
  auVar80._8_4_ = auVar88._8_4_ * fVar170;
  auVar80._12_4_ = auVar88._12_4_ * fVar171;
  auVar80._16_4_ = auVar88._16_4_ * fVar172;
  auVar80._20_4_ = auVar88._20_4_ * fVar174;
  auVar80._24_4_ = auVar88._24_4_ * fVar173;
  auVar80._28_4_ = auVar79._28_4_;
  auVar67 = vfmadd231ps_fma(auVar91,auVar90,auVar81);
  auVar13 = vfmadd231ps_fma(auVar89,auVar90,auVar85);
  auVar65 = vfmadd231ps_fma(auVar80,auVar87,auVar90);
  auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar99,auVar83);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar99,auVar84);
  auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar86,auVar99);
  auVar100._4_4_ = fVar202;
  auVar100._0_4_ = fVar202;
  auVar100._8_4_ = fVar202;
  auVar100._12_4_ = fVar202;
  auVar100._16_4_ = fVar202;
  auVar100._20_4_ = fVar202;
  auVar100._24_4_ = fVar202;
  auVar100._28_4_ = fVar202;
  auVar80 = ZEXT1632(CONCAT412(fVar203 * auVar74._12_4_,
                               CONCAT48(fVar203 * auVar74._8_4_,
                                        CONCAT44(fVar203 * auVar74._4_4_,fVar202))));
  auVar89 = vpermps_avx2(auVar101,auVar80);
  auVar80 = vpermps_avx512vl(auVar78,auVar80);
  fVar203 = auVar80._0_4_;
  fVar142 = auVar80._4_4_;
  auVar90._4_4_ = fVar142 * auVar15._4_4_;
  auVar90._0_4_ = fVar203 * auVar15._0_4_;
  fVar158 = auVar80._8_4_;
  auVar90._8_4_ = fVar158 * auVar15._8_4_;
  fVar170 = auVar80._12_4_;
  auVar90._12_4_ = fVar170 * auVar15._12_4_;
  fVar171 = auVar80._16_4_;
  auVar90._16_4_ = fVar171 * auVar15._16_4_;
  fVar172 = auVar80._20_4_;
  auVar90._20_4_ = fVar172 * auVar15._20_4_;
  fVar174 = auVar80._24_4_;
  auVar90._24_4_ = fVar174 * auVar15._24_4_;
  auVar90._28_4_ = 1;
  auVar78._4_4_ = auVar82._4_4_ * fVar142;
  auVar78._0_4_ = auVar82._0_4_ * fVar203;
  auVar78._8_4_ = auVar82._8_4_ * fVar158;
  auVar78._12_4_ = auVar82._12_4_ * fVar170;
  auVar78._16_4_ = auVar82._16_4_ * fVar171;
  auVar78._20_4_ = auVar82._20_4_ * fVar172;
  auVar78._24_4_ = auVar82._24_4_ * fVar174;
  auVar78._28_4_ = auVar15._28_4_;
  auVar82._4_4_ = auVar88._4_4_ * fVar142;
  auVar82._0_4_ = auVar88._0_4_ * fVar203;
  auVar82._8_4_ = auVar88._8_4_ * fVar158;
  auVar82._12_4_ = auVar88._12_4_ * fVar170;
  auVar82._16_4_ = auVar88._16_4_ * fVar171;
  auVar82._20_4_ = auVar88._20_4_ * fVar172;
  auVar82._24_4_ = auVar88._24_4_ * fVar174;
  auVar82._28_4_ = auVar80._28_4_;
  auVar1 = vfmadd231ps_fma(auVar90,auVar89,auVar81);
  auVar68 = vfmadd231ps_fma(auVar78,auVar89,auVar85);
  auVar73 = vfmadd231ps_fma(auVar82,auVar89,auVar87);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar100,auVar83);
  auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar100,auVar84);
  auVar96._8_4_ = 0x7fffffff;
  auVar96._0_8_ = 0x7fffffff7fffffff;
  auVar96._12_4_ = 0x7fffffff;
  auVar96._16_4_ = 0x7fffffff;
  auVar96._20_4_ = 0x7fffffff;
  auVar96._24_4_ = 0x7fffffff;
  auVar96._28_4_ = 0x7fffffff;
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar100,auVar86);
  auVar83 = vandps_avx(ZEXT1632(auVar67),auVar96);
  auVar98._8_4_ = 0x219392ef;
  auVar98._0_8_ = 0x219392ef219392ef;
  auVar98._12_4_ = 0x219392ef;
  auVar98._16_4_ = 0x219392ef;
  auVar98._20_4_ = 0x219392ef;
  auVar98._24_4_ = 0x219392ef;
  auVar98._28_4_ = 0x219392ef;
  uVar52 = vcmpps_avx512vl(auVar83,auVar98,1);
  bVar56 = (bool)((byte)uVar52 & 1);
  auVar79._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar67._0_4_;
  bVar56 = (bool)((byte)(uVar52 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar67._4_4_;
  bVar56 = (bool)((byte)(uVar52 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar67._8_4_;
  bVar56 = (bool)((byte)(uVar52 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar67._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar52 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar52 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar52 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar52 >> 7) * 0x219392ef;
  auVar83 = vandps_avx(ZEXT1632(auVar13),auVar96);
  uVar52 = vcmpps_avx512vl(auVar83,auVar98,1);
  bVar56 = (bool)((byte)uVar52 & 1);
  auVar92._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar13._0_4_;
  bVar56 = (bool)((byte)(uVar52 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar13._4_4_;
  bVar56 = (bool)((byte)(uVar52 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar13._8_4_;
  bVar56 = (bool)((byte)(uVar52 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar13._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar52 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar52 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar52 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar52 >> 7) * 0x219392ef;
  auVar83 = vandps_avx(ZEXT1632(auVar65),auVar96);
  uVar52 = vcmpps_avx512vl(auVar83,auVar98,1);
  bVar56 = (bool)((byte)uVar52 & 1);
  auVar83._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar65._0_4_;
  bVar56 = (bool)((byte)(uVar52 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar65._4_4_;
  bVar56 = (bool)((byte)(uVar52 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar65._8_4_;
  bVar56 = (bool)((byte)(uVar52 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar65._12_4_;
  auVar83._16_4_ = (uint)((byte)(uVar52 >> 4) & 1) * 0x219392ef;
  auVar83._20_4_ = (uint)((byte)(uVar52 >> 5) & 1) * 0x219392ef;
  auVar83._24_4_ = (uint)((byte)(uVar52 >> 6) & 1) * 0x219392ef;
  auVar83._28_4_ = (uint)(byte)(uVar52 >> 7) * 0x219392ef;
  auVar81 = vrcp14ps_avx512vl(auVar79);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar97._16_4_ = 0x3f800000;
  auVar97._20_4_ = 0x3f800000;
  auVar97._24_4_ = 0x3f800000;
  auVar97._28_4_ = 0x3f800000;
  auVar67 = vfnmadd213ps_fma(auVar79,auVar81,auVar97);
  auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar92);
  auVar13 = vfnmadd213ps_fma(auVar92,auVar81,auVar97);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar83);
  auVar65 = vfnmadd213ps_fma(auVar83,auVar81,auVar97);
  auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar81,auVar81);
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar51 * 7 + 6));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar1));
  auVar86._4_4_ = auVar67._4_4_ * auVar83._4_4_;
  auVar86._0_4_ = auVar67._0_4_ * auVar83._0_4_;
  auVar86._8_4_ = auVar67._8_4_ * auVar83._8_4_;
  auVar86._12_4_ = auVar67._12_4_ * auVar83._12_4_;
  auVar86._16_4_ = auVar83._16_4_ * 0.0;
  auVar86._20_4_ = auVar83._20_4_ * 0.0;
  auVar86._24_4_ = auVar83._24_4_ * 0.0;
  auVar86._28_4_ = auVar83._28_4_;
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar51 * 9 + 6));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar1));
  auVar82 = vpbroadcastd_avx512vl();
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar95._0_4_ = auVar67._0_4_ * auVar83._0_4_;
  auVar95._4_4_ = auVar67._4_4_ * auVar83._4_4_;
  auVar95._8_4_ = auVar67._8_4_ * auVar83._8_4_;
  auVar95._12_4_ = auVar67._12_4_ * auVar83._12_4_;
  auVar95._16_4_ = auVar83._16_4_ * 0.0;
  auVar95._20_4_ = auVar83._20_4_ * 0.0;
  auVar95._24_4_ = auVar83._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar51 * -2 + 6));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar68));
  auVar87._4_4_ = auVar13._4_4_ * auVar83._4_4_;
  auVar87._0_4_ = auVar13._0_4_ * auVar83._0_4_;
  auVar87._8_4_ = auVar13._8_4_ * auVar83._8_4_;
  auVar87._12_4_ = auVar13._12_4_ * auVar83._12_4_;
  auVar87._16_4_ = auVar83._16_4_ * 0.0;
  auVar87._20_4_ = auVar83._20_4_ * 0.0;
  auVar87._24_4_ = auVar83._24_4_ * 0.0;
  auVar87._28_4_ = auVar83._28_4_;
  auVar83 = vcvtdq2ps_avx(auVar81);
  auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar68));
  auVar94._0_4_ = auVar13._0_4_ * auVar83._0_4_;
  auVar94._4_4_ = auVar13._4_4_ * auVar83._4_4_;
  auVar94._8_4_ = auVar13._8_4_ * auVar83._8_4_;
  auVar94._12_4_ = auVar13._12_4_ * auVar83._12_4_;
  auVar94._16_4_ = auVar83._16_4_ * 0.0;
  auVar94._20_4_ = auVar83._20_4_ * 0.0;
  auVar94._24_4_ = auVar83._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar62 + uVar51 + 6));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar73));
  auVar88._4_4_ = auVar83._4_4_ * auVar65._4_4_;
  auVar88._0_4_ = auVar83._0_4_ * auVar65._0_4_;
  auVar88._8_4_ = auVar83._8_4_ * auVar65._8_4_;
  auVar88._12_4_ = auVar83._12_4_ * auVar65._12_4_;
  auVar88._16_4_ = auVar83._16_4_ * 0.0;
  auVar88._20_4_ = auVar83._20_4_ * 0.0;
  auVar88._24_4_ = auVar83._24_4_ * 0.0;
  auVar88._28_4_ = auVar83._28_4_;
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar51 * 0x17 + 6));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar73));
  auVar93._0_4_ = auVar65._0_4_ * auVar83._0_4_;
  auVar93._4_4_ = auVar65._4_4_ * auVar83._4_4_;
  auVar93._8_4_ = auVar65._8_4_ * auVar83._8_4_;
  auVar93._12_4_ = auVar65._12_4_ * auVar83._12_4_;
  auVar93._16_4_ = auVar83._16_4_ * 0.0;
  auVar93._20_4_ = auVar83._20_4_ * 0.0;
  auVar93._24_4_ = auVar83._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar83 = vpminsd_avx2(auVar86,auVar95);
  auVar81 = vpminsd_avx2(auVar87,auVar94);
  auVar83 = vmaxps_avx(auVar83,auVar81);
  auVar81 = vpminsd_avx2(auVar88,auVar93);
  uVar143 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar15._4_4_ = uVar143;
  auVar15._0_4_ = uVar143;
  auVar15._8_4_ = uVar143;
  auVar15._12_4_ = uVar143;
  auVar15._16_4_ = uVar143;
  auVar15._20_4_ = uVar143;
  auVar15._24_4_ = uVar143;
  auVar15._28_4_ = uVar143;
  auVar81 = vmaxps_avx512vl(auVar81,auVar15);
  auVar83 = vmaxps_avx(auVar83,auVar81);
  auVar81._8_4_ = 0x3f7ffffa;
  auVar81._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar81._12_4_ = 0x3f7ffffa;
  auVar81._16_4_ = 0x3f7ffffa;
  auVar81._20_4_ = 0x3f7ffffa;
  auVar81._24_4_ = 0x3f7ffffa;
  auVar81._28_4_ = 0x3f7ffffa;
  local_5e0 = vmulps_avx512vl(auVar83,auVar81);
  auVar83 = vpmaxsd_avx2(auVar86,auVar95);
  auVar81 = vpmaxsd_avx2(auVar87,auVar94);
  auVar83 = vminps_avx(auVar83,auVar81);
  auVar81 = vpmaxsd_avx2(auVar88,auVar93);
  uVar143 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar84._4_4_ = uVar143;
  auVar84._0_4_ = uVar143;
  auVar84._8_4_ = uVar143;
  auVar84._12_4_ = uVar143;
  auVar84._16_4_ = uVar143;
  auVar84._20_4_ = uVar143;
  auVar84._24_4_ = uVar143;
  auVar84._28_4_ = uVar143;
  auVar81 = vminps_avx512vl(auVar81,auVar84);
  auVar83 = vminps_avx(auVar83,auVar81);
  auVar85._8_4_ = 0x3f800003;
  auVar85._0_8_ = 0x3f8000033f800003;
  auVar85._12_4_ = 0x3f800003;
  auVar85._16_4_ = 0x3f800003;
  auVar85._20_4_ = 0x3f800003;
  auVar85._24_4_ = 0x3f800003;
  auVar85._28_4_ = 0x3f800003;
  auVar83 = vmulps_avx512vl(auVar83,auVar85);
  uVar17 = vpcmpgtd_avx512vl(auVar82,_DAT_01fe9900);
  uVar16 = vcmpps_avx512vl(local_5e0,auVar83,2);
  if ((byte)((byte)uVar16 & (byte)uVar17) == 0) {
    return false;
  }
  local_8e8 = (ulong)(byte)((byte)uVar16 & (byte)uVar17);
  auVar156 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar156);
  local_8f0 = prim;
LAB_01ce79df:
  lVar53 = 0;
  for (uVar52 = local_8e8; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
    lVar53 = lVar53 + 1;
  }
  uVar58 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar58].ptr;
  lVar4 = *(long *)&pGVar3[1].time_range.upper;
  uVar52 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(prim + lVar53 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar67 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * uVar52);
  auVar13 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * (uVar52 + 1));
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar1 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar65 = vunpcklps_avx512vl(local_760._0_16_,local_780._0_16_);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar70 = auVar84._0_16_;
  local_990 = vinsertps_avx512f(auVar65,auVar70,0x28);
  auVar74._8_4_ = 0xbeaaaaab;
  auVar74._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar74._12_4_ = 0xbeaaaaab;
  auVar73 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar3[2].intersectionFilterN +
                              uVar52 * (long)pGVar3[2].pointQueryFunc),auVar67,auVar74);
  auVar68 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar3[2].intersectionFilterN +
                             (long)pGVar3[2].pointQueryFunc * (uVar52 + 1)),auVar13,auVar74);
  auVar75._0_4_ = auVar13._0_4_ + auVar67._0_4_ + auVar73._0_4_ + auVar68._0_4_;
  auVar75._4_4_ = auVar13._4_4_ + auVar67._4_4_ + auVar73._4_4_ + auVar68._4_4_;
  auVar75._8_4_ = auVar13._8_4_ + auVar67._8_4_ + auVar73._8_4_ + auVar68._8_4_;
  auVar75._12_4_ = auVar13._12_4_ + auVar67._12_4_ + auVar73._12_4_ + auVar68._12_4_;
  auVar71._8_4_ = 0x3e800000;
  auVar71._0_8_ = 0x3e8000003e800000;
  auVar71._12_4_ = 0x3e800000;
  auVar65 = vmulps_avx512vl(auVar75,auVar71);
  auVar65 = vsubps_avx(auVar65,auVar1);
  auVar65 = vdpps_avx(auVar65,local_990,0x7f);
  fVar203 = *(float *)(ray + k * 4 + 0xc0);
  local_9a0 = vdpps_avx(local_990,local_990,0x7f);
  auVar156 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar156);
  auVar72._4_12_ = ZEXT812(0) << 0x20;
  auVar72._0_4_ = local_9a0._0_4_;
  auVar66 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar72);
  auVar69 = vfnmadd213ss_fma(auVar66,local_9a0,ZEXT416(0x40000000));
  fVar142 = auVar65._0_4_ * auVar66._0_4_ * auVar69._0_4_;
  auVar76._4_4_ = fVar142;
  auVar76._0_4_ = fVar142;
  auVar76._8_4_ = fVar142;
  auVar76._12_4_ = fVar142;
  auVar65 = vfmadd231ps_fma(auVar1,local_990,auVar76);
  auVar65 = vblendps_avx(auVar65,ZEXT816(0) << 0x40,8);
  auVar67 = vsubps_avx(auVar67,auVar65);
  auVar1 = vsubps_avx(auVar68,auVar65);
  auVar68 = vsubps_avx(auVar73,auVar65);
  auVar13 = vsubps_avx(auVar13,auVar65);
  uVar143 = auVar67._0_4_;
  auVar237._4_4_ = uVar143;
  auVar237._0_4_ = uVar143;
  auVar237._8_4_ = uVar143;
  auVar237._12_4_ = uVar143;
  auVar237._16_4_ = uVar143;
  auVar237._20_4_ = uVar143;
  auVar237._24_4_ = uVar143;
  auVar237._28_4_ = uVar143;
  auVar103._8_4_ = 1;
  auVar103._0_8_ = 0x100000001;
  auVar103._12_4_ = 1;
  auVar103._16_4_ = 1;
  auVar103._20_4_ = 1;
  auVar103._24_4_ = 1;
  auVar103._28_4_ = 1;
  local_860 = ZEXT1632(auVar67);
  auVar83 = vpermps_avx2(auVar103,local_860);
  auVar104._8_4_ = 2;
  auVar104._0_8_ = 0x200000002;
  auVar104._12_4_ = 2;
  auVar104._16_4_ = 2;
  auVar104._20_4_ = 2;
  auVar104._24_4_ = 2;
  auVar104._28_4_ = 2;
  auVar85 = vpermps_avx512vl(auVar104,local_860);
  auVar105._8_4_ = 3;
  auVar105._0_8_ = 0x300000003;
  auVar105._12_4_ = 3;
  auVar105._16_4_ = 3;
  auVar105._20_4_ = 3;
  auVar105._24_4_ = 3;
  auVar105._28_4_ = 3;
  auVar81 = vpermps_avx2(auVar105,local_860);
  uVar143 = auVar68._0_4_;
  local_5a0._4_4_ = uVar143;
  local_5a0._0_4_ = uVar143;
  local_5a0._8_4_ = uVar143;
  local_5a0._12_4_ = uVar143;
  local_5a0._16_4_ = uVar143;
  local_5a0._20_4_ = uVar143;
  local_5a0._24_4_ = uVar143;
  local_5a0._28_4_ = uVar143;
  local_8a0 = ZEXT1632(auVar68);
  local_8e0 = vpermps_avx2(auVar103,local_8a0);
  auVar15 = vpermps_avx2(auVar104,local_8a0);
  auVar82 = vpermps_avx512vl(auVar105,local_8a0);
  auVar86 = vbroadcastss_avx512vl(auVar1);
  local_880 = ZEXT1632(auVar1);
  auVar87 = vpermps_avx512vl(auVar103,local_880);
  auVar88 = vpermps_avx512vl(auVar104,local_880);
  auVar89 = vpermps_avx512vl(auVar105,local_880);
  auVar221 = ZEXT3264(local_8e0);
  auVar80 = vbroadcastss_avx512vl(auVar13);
  _local_8c0 = ZEXT1632(auVar13);
  auVar90 = vpermps_avx512vl(auVar103,_local_8c0);
  auVar91 = vpermps_avx512vl(auVar104,_local_8c0);
  auVar78 = vpermps_avx512vl(auVar105,_local_8c0);
  auVar67 = vmulss_avx512f(auVar70,auVar70);
  auVar79 = vfmadd231ps_avx512vl(ZEXT1632(auVar67),local_780,local_780);
  local_580 = vfmadd231ps_avx512vl(auVar79,local_760,local_760);
  uVar143 = local_580._0_4_;
  local_560._4_4_ = uVar143;
  local_560._0_4_ = uVar143;
  local_560._8_4_ = uVar143;
  local_560._12_4_ = uVar143;
  local_560._16_4_ = uVar143;
  local_560._20_4_ = uVar143;
  local_560._24_4_ = uVar143;
  local_560._28_4_ = uVar143;
  auVar102._8_4_ = 0x7fffffff;
  auVar102._0_8_ = 0x7fffffff7fffffff;
  auVar102._12_4_ = 0x7fffffff;
  auVar102._16_4_ = 0x7fffffff;
  auVar102._20_4_ = 0x7fffffff;
  auVar102._24_4_ = 0x7fffffff;
  auVar102._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar102);
  local_950 = ZEXT416((uint)fVar142);
  local_5c0 = fVar203 - fVar142;
  fStack_5bc = local_5c0;
  fStack_5b8 = local_5c0;
  fStack_5b4 = local_5c0;
  fStack_5b0 = local_5c0;
  fStack_5ac = local_5c0;
  fStack_5a8 = local_5c0;
  fStack_5a4 = local_5c0;
  uVar52 = 0;
  bVar56 = false;
  local_cb4 = 1;
  auVar156 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar156);
  auVar67 = vsqrtss_avx(local_9a0,local_9a0);
  auVar13 = vsqrtss_avx(local_9a0,local_9a0);
  local_960 = ZEXT816(0x3f80000000000000);
  auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  do {
    auVar65 = vmovshdup_avx(local_960);
    auVar65 = vsubps_avx(auVar65,local_960);
    fVar158 = auVar65._0_4_;
    fVar174 = fVar158 * 0.04761905;
    auVar214._0_4_ = local_960._0_4_;
    auVar214._4_4_ = auVar214._0_4_;
    auVar214._8_4_ = auVar214._0_4_;
    auVar214._12_4_ = auVar214._0_4_;
    auVar214._16_4_ = auVar214._0_4_;
    auVar214._20_4_ = auVar214._0_4_;
    auVar214._24_4_ = auVar214._0_4_;
    auVar214._28_4_ = auVar214._0_4_;
    auVar235._4_4_ = fVar158;
    auVar235._0_4_ = fVar158;
    auVar235._8_4_ = fVar158;
    auVar235._12_4_ = fVar158;
    auVar235._16_4_ = fVar158;
    auVar235._20_4_ = fVar158;
    auVar235._24_4_ = fVar158;
    auVar235._28_4_ = fVar158;
    auVar65 = vfmadd231ps_fma(auVar214,auVar235,_DAT_01faff20);
    auVar226 = auVar156._0_32_;
    auVar79 = vsubps_avx(auVar226,ZEXT1632(auVar65));
    fVar158 = auVar65._0_4_;
    fVar170 = auVar65._4_4_;
    auVar117._4_4_ = local_5a0._4_4_ * fVar170;
    auVar117._0_4_ = local_5a0._0_4_ * fVar158;
    fVar171 = auVar65._8_4_;
    auVar117._8_4_ = local_5a0._8_4_ * fVar171;
    fVar172 = auVar65._12_4_;
    auVar117._12_4_ = local_5a0._12_4_ * fVar172;
    auVar117._16_4_ = local_5a0._16_4_ * 0.0;
    auVar117._20_4_ = local_5a0._20_4_ * 0.0;
    auVar117._24_4_ = local_5a0._24_4_ * 0.0;
    auVar117._28_4_ = DAT_01faff20._28_4_;
    auVar111._4_4_ = auVar221._4_4_ * fVar170;
    auVar111._0_4_ = auVar221._0_4_ * fVar158;
    auVar111._8_4_ = auVar221._8_4_ * fVar171;
    auVar111._12_4_ = auVar221._12_4_ * fVar172;
    auVar111._16_4_ = auVar221._16_4_ * 0.0;
    auVar111._20_4_ = auVar221._20_4_ * 0.0;
    auVar111._24_4_ = auVar221._24_4_ * 0.0;
    auVar111._28_4_ = auVar214._0_4_;
    auVar156._0_4_ = auVar15._0_4_ * fVar158;
    auVar156._4_4_ = auVar15._4_4_ * fVar170;
    auVar156._8_4_ = auVar15._8_4_ * fVar171;
    auVar156._12_4_ = auVar15._12_4_ * fVar172;
    auVar156._16_4_ = auVar15._16_4_ * 0.0;
    auVar156._20_4_ = auVar15._20_4_ * 0.0;
    auVar156._28_36_ = auVar221._28_36_;
    auVar156._24_4_ = auVar15._24_4_ * 0.0;
    auVar92 = vmulps_avx512vl(auVar82,ZEXT1632(auVar65));
    auVar1 = vfmadd231ps_fma(auVar117,auVar79,auVar237);
    auVar68 = vfmadd231ps_fma(auVar111,auVar79,auVar83);
    auVar93 = vfmadd231ps_avx512vl(auVar156._0_32_,auVar79,auVar85);
    auVar73 = vfmadd231ps_fma(auVar92,auVar79,auVar81);
    auVar92 = vmulps_avx512vl(auVar86,ZEXT1632(auVar65));
    auVar98 = ZEXT1632(auVar65);
    auVar94 = vmulps_avx512vl(auVar87,auVar98);
    auVar95 = vmulps_avx512vl(auVar88,auVar98);
    auVar96 = vmulps_avx512vl(auVar89,auVar98);
    auVar69 = vfmadd231ps_fma(auVar92,auVar79,local_5a0);
    auVar66 = vfmadd231ps_fma(auVar94,auVar79,auVar221._0_32_);
    auVar70 = vfmadd231ps_fma(auVar95,auVar79,auVar15);
    auVar92 = vfmadd231ps_avx512vl(auVar96,auVar79,auVar82);
    auVar94 = vmulps_avx512vl(auVar80,auVar98);
    auVar95 = vmulps_avx512vl(auVar90,auVar98);
    auVar96 = vmulps_avx512vl(auVar91,auVar98);
    auVar97 = vmulps_avx512vl(auVar78,auVar98);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar79,auVar86);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar79,auVar87);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar79,auVar88);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar79,auVar89);
    auVar121._28_4_ = auVar15._28_4_;
    auVar121._0_28_ =
         ZEXT1628(CONCAT412(fVar172 * auVar69._12_4_,
                            CONCAT48(fVar171 * auVar69._8_4_,
                                     CONCAT44(fVar170 * auVar69._4_4_,fVar158 * auVar69._0_4_))));
    auVar98 = vmulps_avx512vl(auVar98,ZEXT1632(auVar66));
    auVar99 = vmulps_avx512vl(ZEXT1632(auVar65),ZEXT1632(auVar70));
    auVar100 = vmulps_avx512vl(ZEXT1632(auVar65),auVar92);
    auVar65 = vfmadd231ps_fma(auVar121,auVar79,ZEXT1632(auVar1));
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar79,ZEXT1632(auVar68));
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar79,auVar93);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar79,ZEXT1632(auVar73));
    auVar231._0_4_ = auVar94._0_4_ * fVar158;
    auVar231._4_4_ = auVar94._4_4_ * fVar170;
    auVar231._8_4_ = auVar94._8_4_ * fVar171;
    auVar231._12_4_ = auVar94._12_4_ * fVar172;
    auVar231._16_4_ = auVar94._16_4_ * 0.0;
    auVar231._20_4_ = auVar94._20_4_ * 0.0;
    auVar231._24_4_ = auVar94._24_4_ * 0.0;
    auVar231._28_4_ = 0;
    auVar112._4_4_ = auVar95._4_4_ * fVar170;
    auVar112._0_4_ = auVar95._0_4_ * fVar158;
    auVar112._8_4_ = auVar95._8_4_ * fVar171;
    auVar112._12_4_ = auVar95._12_4_ * fVar172;
    auVar112._16_4_ = auVar95._16_4_ * 0.0;
    auVar112._20_4_ = auVar95._20_4_ * 0.0;
    auVar112._24_4_ = auVar95._24_4_ * 0.0;
    auVar112._28_4_ = auVar94._28_4_;
    auVar113._4_4_ = auVar96._4_4_ * fVar170;
    auVar113._0_4_ = auVar96._0_4_ * fVar158;
    auVar113._8_4_ = auVar96._8_4_ * fVar171;
    auVar113._12_4_ = auVar96._12_4_ * fVar172;
    auVar113._16_4_ = auVar96._16_4_ * 0.0;
    auVar113._20_4_ = auVar96._20_4_ * 0.0;
    auVar113._24_4_ = auVar96._24_4_ * 0.0;
    auVar113._28_4_ = auVar95._28_4_;
    auVar114._4_4_ = auVar97._4_4_ * fVar170;
    auVar114._0_4_ = auVar97._0_4_ * fVar158;
    auVar114._8_4_ = auVar97._8_4_ * fVar171;
    auVar114._12_4_ = auVar97._12_4_ * fVar172;
    auVar114._16_4_ = auVar97._16_4_ * 0.0;
    auVar114._20_4_ = auVar97._20_4_ * 0.0;
    auVar114._24_4_ = auVar97._24_4_ * 0.0;
    auVar114._28_4_ = auVar96._28_4_;
    auVar1 = vfmadd231ps_fma(auVar231,auVar79,ZEXT1632(auVar69));
    auVar68 = vfmadd231ps_fma(auVar112,auVar79,ZEXT1632(auVar66));
    auVar73 = vfmadd231ps_fma(auVar113,auVar79,ZEXT1632(auVar70));
    auVar69 = vfmadd231ps_fma(auVar114,auVar79,auVar92);
    auVar219._28_4_ = auVar93._28_4_;
    auVar219._0_28_ =
         ZEXT1628(CONCAT412(fVar172 * auVar1._12_4_,
                            CONCAT48(fVar171 * auVar1._8_4_,
                                     CONCAT44(fVar170 * auVar1._4_4_,fVar158 * auVar1._0_4_))));
    auVar66 = vfmadd231ps_fma(auVar219,auVar79,ZEXT1632(auVar65));
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar68._12_4_ * fVar172,
                                            CONCAT48(auVar68._8_4_ * fVar171,
                                                     CONCAT44(auVar68._4_4_ * fVar170,
                                                              auVar68._0_4_ * fVar158)))),auVar79,
                         auVar98);
    auVar101 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar73._12_4_ * fVar172,
                                             CONCAT48(auVar73._8_4_ * fVar171,
                                                      CONCAT44(auVar73._4_4_ * fVar170,
                                                               auVar73._0_4_ * fVar158)))),auVar79,
                          auVar99);
    auVar92 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar69._12_4_ * fVar172,
                                            CONCAT48(auVar69._8_4_ * fVar171,
                                                     CONCAT44(auVar69._4_4_ * fVar170,
                                                              auVar69._0_4_ * fVar158)))),auVar100,
                         auVar79);
    auVar79 = vsubps_avx(ZEXT1632(auVar1),ZEXT1632(auVar65));
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar68),auVar98);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar73),auVar99);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar69),auVar100);
    auVar240._0_4_ = fVar174 * auVar79._0_4_ * 3.0;
    auVar240._4_4_ = fVar174 * auVar79._4_4_ * 3.0;
    auVar240._8_4_ = fVar174 * auVar79._8_4_ * 3.0;
    auVar240._12_4_ = fVar174 * auVar79._12_4_ * 3.0;
    auVar240._16_4_ = fVar174 * auVar79._16_4_ * 3.0;
    auVar240._20_4_ = fVar174 * auVar79._20_4_ * 3.0;
    auVar240._24_4_ = fVar174 * auVar79._24_4_ * 3.0;
    auVar240._28_4_ = 0;
    auVar242._0_4_ = fVar174 * auVar93._0_4_ * 3.0;
    auVar242._4_4_ = fVar174 * auVar93._4_4_ * 3.0;
    auVar242._8_4_ = fVar174 * auVar93._8_4_ * 3.0;
    auVar242._12_4_ = fVar174 * auVar93._12_4_ * 3.0;
    auVar242._16_4_ = fVar174 * auVar93._16_4_ * 3.0;
    auVar242._20_4_ = fVar174 * auVar93._20_4_ * 3.0;
    auVar242._24_4_ = fVar174 * auVar93._24_4_ * 3.0;
    auVar242._28_4_ = 0;
    auVar120._4_4_ = fVar174 * auVar94._4_4_ * 3.0;
    auVar120._0_4_ = fVar174 * auVar94._0_4_ * 3.0;
    auVar120._8_4_ = fVar174 * auVar94._8_4_ * 3.0;
    auVar120._12_4_ = fVar174 * auVar94._12_4_ * 3.0;
    auVar120._16_4_ = fVar174 * auVar94._16_4_ * 3.0;
    auVar120._20_4_ = fVar174 * auVar94._20_4_ * 3.0;
    auVar120._24_4_ = fVar174 * auVar94._24_4_ * 3.0;
    auVar120._28_4_ = auVar97._28_4_;
    fVar158 = auVar95._0_4_ * 3.0 * fVar174;
    fVar170 = auVar95._4_4_ * 3.0 * fVar174;
    auVar115._4_4_ = fVar170;
    auVar115._0_4_ = fVar158;
    fVar171 = auVar95._8_4_ * 3.0 * fVar174;
    auVar115._8_4_ = fVar171;
    fVar172 = auVar95._12_4_ * 3.0 * fVar174;
    auVar115._12_4_ = fVar172;
    fVar173 = auVar95._16_4_ * 3.0 * fVar174;
    auVar115._16_4_ = fVar173;
    fVar202 = auVar95._20_4_ * 3.0 * fVar174;
    auVar115._20_4_ = fVar202;
    fVar175 = auVar95._24_4_ * 3.0 * fVar174;
    auVar115._24_4_ = fVar175;
    auVar115._28_4_ = fVar174;
    auVar65 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar65);
    auVar97 = vpermt2ps_avx512vl(ZEXT1632(auVar66),_DAT_01feed00,ZEXT1632(auVar65));
    auVar98 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,ZEXT1632(auVar65));
    auVar93 = ZEXT1632(auVar65);
    auVar99 = vpermt2ps_avx512vl(auVar101,_DAT_01feed00,auVar93);
    auVar227._0_4_ = auVar92._0_4_ + fVar158;
    auVar227._4_4_ = auVar92._4_4_ + fVar170;
    auVar227._8_4_ = auVar92._8_4_ + fVar171;
    auVar227._12_4_ = auVar92._12_4_ + fVar172;
    auVar227._16_4_ = auVar92._16_4_ + fVar173;
    auVar227._20_4_ = auVar92._20_4_ + fVar202;
    auVar227._24_4_ = auVar92._24_4_ + fVar175;
    auVar227._28_4_ = auVar92._28_4_ + fVar174;
    auVar79 = vmaxps_avx(auVar92,auVar227);
    auVar100 = vminps_avx512vl(auVar92,auVar227);
    auVar102 = vpermt2ps_avx512vl(auVar92,_DAT_01feed00,auVar93);
    auVar103 = vpermt2ps_avx512vl(auVar240,_DAT_01feed00,auVar93);
    auVar104 = vpermt2ps_avx512vl(auVar242,_DAT_01feed00,auVar93);
    auVar117 = ZEXT1632(auVar65);
    auVar105 = vpermt2ps_avx512vl(auVar120,_DAT_01feed00,auVar117);
    auVar92 = vpermt2ps_avx512vl(auVar115,_DAT_01feed00,auVar117);
    auVar92 = vsubps_avx(auVar102,auVar92);
    auVar93 = vsubps_avx(auVar97,ZEXT1632(auVar66));
    auVar94 = vsubps_avx(auVar98,auVar96);
    auVar95 = vsubps_avx(auVar99,auVar101);
    auVar106 = vmulps_avx512vl(auVar94,auVar120);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar242,auVar95);
    auVar107 = vmulps_avx512vl(auVar95,auVar240);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar120,auVar93);
    auVar108 = vmulps_avx512vl(auVar93,auVar242);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar240,auVar94);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar107 = vmulps_avx512vl(auVar95,auVar95);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar94,auVar94);
    auVar109 = vfmadd231ps_avx512vl(auVar107,auVar93,auVar93);
    auVar107 = vrcp14ps_avx512vl(auVar109);
    auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar109,auVar226);
    auVar107 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vmulps_avx512vl(auVar106,auVar107);
    auVar108 = vmulps_avx512vl(auVar94,auVar105);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar104,auVar95);
    auVar110 = vmulps_avx512vl(auVar95,auVar103);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar105,auVar93);
    auVar111 = vmulps_avx512vl(auVar93,auVar104);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar103,auVar94);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar108 = vfmadd231ps_avx512vl(auVar110,auVar108,auVar108);
    auVar107 = vmulps_avx512vl(auVar108,auVar107);
    auVar106 = vmaxps_avx512vl(auVar106,auVar107);
    auVar106 = vsqrtps_avx512vl(auVar106);
    auVar107 = vmaxps_avx512vl(auVar92,auVar102);
    auVar79 = vmaxps_avx512vl(auVar79,auVar107);
    auVar110 = vaddps_avx512vl(auVar106,auVar79);
    auVar79 = vminps_avx(auVar92,auVar102);
    auVar79 = vminps_avx512vl(auVar100,auVar79);
    auVar79 = vsubps_avx512vl(auVar79,auVar106);
    auVar106._8_4_ = 0x3f800002;
    auVar106._0_8_ = 0x3f8000023f800002;
    auVar106._12_4_ = 0x3f800002;
    auVar106._16_4_ = 0x3f800002;
    auVar106._20_4_ = 0x3f800002;
    auVar106._24_4_ = 0x3f800002;
    auVar106._28_4_ = 0x3f800002;
    auVar92 = vmulps_avx512vl(auVar110,auVar106);
    auVar107._8_4_ = 0x3f7ffffc;
    auVar107._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar107._12_4_ = 0x3f7ffffc;
    auVar107._16_4_ = 0x3f7ffffc;
    auVar107._20_4_ = 0x3f7ffffc;
    auVar107._24_4_ = 0x3f7ffffc;
    auVar107._28_4_ = 0x3f7ffffc;
    auVar79 = vmulps_avx512vl(auVar79,auVar107);
    auVar92 = vmulps_avx512vl(auVar92,auVar92);
    auVar100 = vrsqrt14ps_avx512vl(auVar109);
    auVar108._8_4_ = 0xbf000000;
    auVar108._0_8_ = 0xbf000000bf000000;
    auVar108._12_4_ = 0xbf000000;
    auVar108._16_4_ = 0xbf000000;
    auVar108._20_4_ = 0xbf000000;
    auVar108._24_4_ = 0xbf000000;
    auVar108._28_4_ = 0xbf000000;
    auVar102 = vmulps_avx512vl(auVar109,auVar108);
    fVar158 = auVar100._0_4_;
    fVar170 = auVar100._4_4_;
    fVar171 = auVar100._8_4_;
    fVar172 = auVar100._12_4_;
    fVar174 = auVar100._16_4_;
    fVar173 = auVar100._20_4_;
    fVar202 = auVar100._24_4_;
    auVar116._4_4_ = fVar170 * fVar170 * fVar170 * auVar102._4_4_;
    auVar116._0_4_ = fVar158 * fVar158 * fVar158 * auVar102._0_4_;
    auVar116._8_4_ = fVar171 * fVar171 * fVar171 * auVar102._8_4_;
    auVar116._12_4_ = fVar172 * fVar172 * fVar172 * auVar102._12_4_;
    auVar116._16_4_ = fVar174 * fVar174 * fVar174 * auVar102._16_4_;
    auVar116._20_4_ = fVar173 * fVar173 * fVar173 * auVar102._20_4_;
    auVar116._24_4_ = fVar202 * fVar202 * fVar202 * auVar102._24_4_;
    auVar116._28_4_ = auVar110._28_4_;
    auVar109._8_4_ = 0x3fc00000;
    auVar109._0_8_ = 0x3fc000003fc00000;
    auVar109._12_4_ = 0x3fc00000;
    auVar109._16_4_ = 0x3fc00000;
    auVar109._20_4_ = 0x3fc00000;
    auVar109._24_4_ = 0x3fc00000;
    auVar109._28_4_ = 0x3fc00000;
    auVar100 = vfmadd231ps_avx512vl(auVar116,auVar100,auVar109);
    auVar102 = vmulps_avx512vl(auVar93,auVar100);
    auVar106 = vmulps_avx512vl(auVar94,auVar100);
    auVar107 = vmulps_avx512vl(auVar95,auVar100);
    auVar219 = ZEXT1632(auVar66);
    auVar108 = vsubps_avx512vl(auVar117,auVar219);
    auVar109 = vsubps_avx512vl(auVar117,auVar96);
    auVar111 = vsubps_avx512vl(auVar117,auVar101);
    auVar110 = vmulps_avx512vl(auVar84,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_780,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_760,auVar108);
    auVar112 = vmulps_avx512vl(auVar111,auVar111);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,auVar109);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar108);
    auVar113 = vmulps_avx512vl(auVar84,auVar107);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar106,local_780);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar102,local_760);
    auVar107 = vmulps_avx512vl(auVar111,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar106);
    auVar102 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar102);
    auVar106 = vmulps_avx512vl(auVar113,auVar113);
    auVar107 = vsubps_avx512vl(local_560,auVar106);
    auVar114 = vmulps_avx512vl(auVar113,auVar102);
    auVar110 = vsubps_avx512vl(auVar110,auVar114);
    auVar114 = vaddps_avx512vl(auVar110,auVar110);
    auVar110 = vmulps_avx512vl(auVar102,auVar102);
    auVar112 = vsubps_avx512vl(auVar112,auVar110);
    auVar92 = vsubps_avx512vl(auVar112,auVar92);
    local_7a0 = vmulps_avx512vl(auVar114,auVar114);
    auVar110._8_4_ = 0x40800000;
    auVar110._0_8_ = 0x4080000040800000;
    auVar110._12_4_ = 0x40800000;
    auVar110._16_4_ = 0x40800000;
    auVar110._20_4_ = 0x40800000;
    auVar110._24_4_ = 0x40800000;
    auVar110._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar107,auVar110);
    auVar110 = vmulps_avx512vl(_local_7c0,auVar92);
    auVar110 = vsubps_avx512vl(local_7a0,auVar110);
    uVar62 = vcmpps_avx512vl(auVar110,auVar117,5);
    bVar48 = (byte)uVar62;
    if (bVar48 == 0) {
      auVar156 = ZEXT3264(auVar226);
LAB_01ce8656:
      auVar221 = ZEXT3264(local_8e0);
    }
    else {
      local_740._0_32_ = auVar112;
      auVar110 = vsqrtps_avx512vl(auVar110);
      auVar115 = vaddps_avx512vl(auVar107,auVar107);
      local_840 = vrcp14ps_avx512vl(auVar115);
      in_ZMM31 = ZEXT3264(local_840);
      auVar116 = vfnmadd213ps_avx512vl(local_840,auVar115,auVar226);
      auVar116 = vfmadd132ps_avx512vl(auVar116,local_840,local_840);
      auVar226._8_4_ = 0x80000000;
      auVar226._0_8_ = 0x8000000080000000;
      auVar226._12_4_ = 0x80000000;
      auVar226._16_4_ = 0x80000000;
      auVar226._20_4_ = 0x80000000;
      auVar226._24_4_ = 0x80000000;
      auVar226._28_4_ = 0x80000000;
      local_980 = vxorps_avx512vl(auVar114,auVar226);
      auVar117 = vsubps_avx512vl(local_980,auVar110);
      local_9c0 = vmulps_avx512vl(auVar117,auVar116);
      auVar110 = vsubps_avx512vl(auVar110,auVar114);
      local_7e0 = vmulps_avx512vl(auVar110,auVar116);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = vblendmps_avx512vl(auVar110,local_9c0);
      auVar118._0_4_ =
           (uint)(bVar48 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar48 & 1) * auVar110._0_4_;
      bVar60 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar60 * auVar116._4_4_ | (uint)!bVar60 * auVar110._4_4_;
      bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar60 * auVar116._8_4_ | (uint)!bVar60 * auVar110._8_4_;
      bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar60 * auVar116._12_4_ | (uint)!bVar60 * auVar110._12_4_;
      bVar60 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar60 * auVar116._16_4_ | (uint)!bVar60 * auVar110._16_4_;
      bVar60 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar60 * auVar116._20_4_ | (uint)!bVar60 * auVar110._20_4_;
      bVar60 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar60 * auVar116._24_4_ | (uint)!bVar60 * auVar110._24_4_;
      bVar60 = SUB81(uVar62 >> 7,0);
      auVar118._28_4_ = (uint)bVar60 * auVar116._28_4_ | (uint)!bVar60 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar116 = vblendmps_avx512vl(auVar110,local_7e0);
      auVar119._0_4_ =
           (uint)(bVar48 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar48 & 1) * auVar110._0_4_;
      bVar60 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar60 * auVar116._4_4_ | (uint)!bVar60 * auVar110._4_4_;
      bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar60 * auVar116._8_4_ | (uint)!bVar60 * auVar110._8_4_;
      bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar60 * auVar116._12_4_ | (uint)!bVar60 * auVar110._12_4_;
      bVar60 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar60 * auVar116._16_4_ | (uint)!bVar60 * auVar110._16_4_;
      bVar60 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar60 * auVar116._20_4_ | (uint)!bVar60 * auVar110._20_4_;
      bVar60 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar60 * auVar116._24_4_ | (uint)!bVar60 * auVar110._24_4_;
      bVar60 = SUB81(uVar62 >> 7,0);
      auVar119._28_4_ = (uint)bVar60 * auVar116._28_4_ | (uint)!bVar60 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar106,auVar110);
      local_800 = vmaxps_avx512vl(local_580,auVar110);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      local_820 = vmulps_avx512vl(local_800,auVar30);
      vandps_avx512vl(auVar107,auVar110);
      uVar51 = vcmpps_avx512vl(local_820,local_820,1);
      uVar62 = uVar62 & uVar51;
      bVar54 = (byte)uVar62;
      if (bVar54 != 0) {
        uVar51 = vcmpps_avx512vl(auVar92,_DAT_01faff00,2);
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar107 = vblendmps_avx512vl(auVar92,auVar106);
        bVar55 = (byte)uVar51;
        uVar64 = (uint)(bVar55 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar55 & 1) * local_820._0_4_;
        bVar60 = (bool)((byte)(uVar51 >> 1) & 1);
        uVar63 = (uint)bVar60 * auVar107._4_4_ | (uint)!bVar60 * local_820._4_4_;
        bVar60 = (bool)((byte)(uVar51 >> 2) & 1);
        uVar135 = (uint)bVar60 * auVar107._8_4_ | (uint)!bVar60 * local_820._8_4_;
        bVar60 = (bool)((byte)(uVar51 >> 3) & 1);
        uVar136 = (uint)bVar60 * auVar107._12_4_ | (uint)!bVar60 * local_820._12_4_;
        bVar60 = (bool)((byte)(uVar51 >> 4) & 1);
        uVar137 = (uint)bVar60 * auVar107._16_4_ | (uint)!bVar60 * local_820._16_4_;
        bVar60 = (bool)((byte)(uVar51 >> 5) & 1);
        uVar138 = (uint)bVar60 * auVar107._20_4_ | (uint)!bVar60 * local_820._20_4_;
        bVar60 = (bool)((byte)(uVar51 >> 6) & 1);
        uVar139 = (uint)bVar60 * auVar107._24_4_ | (uint)!bVar60 * local_820._24_4_;
        bVar60 = SUB81(uVar51 >> 7,0);
        uVar140 = (uint)bVar60 * auVar107._28_4_ | (uint)!bVar60 * local_820._28_4_;
        auVar118._0_4_ = (bVar54 & 1) * uVar64 | !(bool)(bVar54 & 1) * auVar118._0_4_;
        bVar60 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar118._4_4_ = bVar60 * uVar63 | !bVar60 * auVar118._4_4_;
        bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar118._8_4_ = bVar60 * uVar135 | !bVar60 * auVar118._8_4_;
        bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar118._12_4_ = bVar60 * uVar136 | !bVar60 * auVar118._12_4_;
        bVar60 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar118._16_4_ = bVar60 * uVar137 | !bVar60 * auVar118._16_4_;
        bVar60 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar118._20_4_ = bVar60 * uVar138 | !bVar60 * auVar118._20_4_;
        bVar60 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar118._24_4_ = bVar60 * uVar139 | !bVar60 * auVar118._24_4_;
        bVar60 = SUB81(uVar62 >> 7,0);
        auVar118._28_4_ = bVar60 * uVar140 | !bVar60 * auVar118._28_4_;
        auVar92 = vblendmps_avx512vl(auVar106,auVar92);
        bVar60 = (bool)((byte)(uVar51 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar51 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar51 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar51 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar51 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar51 >> 6) & 1);
        bVar12 = SUB81(uVar51 >> 7,0);
        auVar119._0_4_ =
             (uint)(bVar54 & 1) *
             ((uint)(bVar55 & 1) * auVar92._0_4_ | !(bool)(bVar55 & 1) * uVar64) |
             !(bool)(bVar54 & 1) * auVar119._0_4_;
        bVar6 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar119._4_4_ =
             (uint)bVar6 * ((uint)bVar60 * auVar92._4_4_ | !bVar60 * uVar63) |
             !bVar6 * auVar119._4_4_;
        bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar119._8_4_ =
             (uint)bVar60 * ((uint)bVar7 * auVar92._8_4_ | !bVar7 * uVar135) |
             !bVar60 * auVar119._8_4_;
        bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar119._12_4_ =
             (uint)bVar60 * ((uint)bVar8 * auVar92._12_4_ | !bVar8 * uVar136) |
             !bVar60 * auVar119._12_4_;
        bVar60 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar119._16_4_ =
             (uint)bVar60 * ((uint)bVar9 * auVar92._16_4_ | !bVar9 * uVar137) |
             !bVar60 * auVar119._16_4_;
        bVar60 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar119._20_4_ =
             (uint)bVar60 * ((uint)bVar10 * auVar92._20_4_ | !bVar10 * uVar138) |
             !bVar60 * auVar119._20_4_;
        bVar60 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar119._24_4_ =
             (uint)bVar60 * ((uint)bVar11 * auVar92._24_4_ | !bVar11 * uVar139) |
             !bVar60 * auVar119._24_4_;
        bVar60 = SUB81(uVar62 >> 7,0);
        auVar119._28_4_ =
             (uint)bVar60 * ((uint)bVar12 * auVar92._28_4_ | !bVar12 * uVar140) |
             !bVar60 * auVar119._28_4_;
        bVar48 = (~bVar54 | bVar55) & bVar48;
      }
      if ((bVar48 & 0x7f) == 0) {
        auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        goto LAB_01ce8656;
      }
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar105 = vxorps_avx512vl(auVar105,auVar92);
      auVar103 = vxorps_avx512vl(auVar103,auVar92);
      uVar64 = *(uint *)(ray + k * 4 + 0x200);
      auVar104 = vxorps_avx512vl(auVar104,auVar92);
      auVar65 = vsubss_avx512f(ZEXT416(uVar64),ZEXT416((uint)local_950._0_4_));
      auVar106 = vbroadcastss_avx512vl(auVar65);
      auVar106 = vminps_avx512vl(auVar106,auVar119);
      auVar47._4_4_ = fStack_5bc;
      auVar47._0_4_ = local_5c0;
      auVar47._8_4_ = fStack_5b8;
      auVar47._12_4_ = fStack_5b4;
      auVar47._16_4_ = fStack_5b0;
      auVar47._20_4_ = fStack_5ac;
      auVar47._24_4_ = fStack_5a8;
      auVar47._28_4_ = fStack_5a4;
      auVar107 = vmaxps_avx512vl(auVar47,auVar118);
      auVar110 = vmulps_avx512vl(auVar111,auVar120);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar242,auVar110);
      auVar65 = vfmadd213ps_fma(auVar108,auVar240,auVar109);
      in_ZMM31 = ZEXT3264(auVar84);
      auVar108 = vmulps_avx512vl(auVar84,auVar120);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_780,auVar242);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_760,auVar240);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar108,auVar109);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar109,auVar110,1);
      auVar111 = vxorps_avx512vl(ZEXT1632(auVar65),auVar92);
      auVar120 = vrcp14ps_avx512vl(auVar108);
      auVar116 = vxorps_avx512vl(auVar108,auVar92);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar121 = vfnmadd213ps_avx512vl(auVar120,auVar108,auVar117);
      auVar65 = vfmadd132ps_fma(auVar121,auVar120,auVar120);
      fVar158 = auVar65._0_4_ * auVar111._0_4_;
      fVar170 = auVar65._4_4_ * auVar111._4_4_;
      auVar36._4_4_ = fVar170;
      auVar36._0_4_ = fVar158;
      fVar171 = auVar65._8_4_ * auVar111._8_4_;
      auVar36._8_4_ = fVar171;
      fVar172 = auVar65._12_4_ * auVar111._12_4_;
      auVar36._12_4_ = fVar172;
      fVar174 = auVar111._16_4_ * 0.0;
      auVar36._16_4_ = fVar174;
      fVar173 = auVar111._20_4_ * 0.0;
      auVar36._20_4_ = fVar173;
      fVar202 = auVar111._24_4_ * 0.0;
      auVar36._24_4_ = fVar202;
      auVar36._28_4_ = auVar111._28_4_;
      uVar17 = vcmpps_avx512vl(auVar108,auVar116,1);
      bVar54 = (byte)uVar16 | (byte)uVar17;
      auVar238._8_4_ = 0xff800000;
      auVar238._0_8_ = 0xff800000ff800000;
      auVar238._12_4_ = 0xff800000;
      auVar238._16_4_ = 0xff800000;
      auVar238._20_4_ = 0xff800000;
      auVar238._24_4_ = 0xff800000;
      auVar238._28_4_ = 0xff800000;
      auVar121 = vblendmps_avx512vl(auVar36,auVar238);
      auVar122._0_4_ =
           (uint)(bVar54 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar120._0_4_;
      bVar60 = (bool)(bVar54 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar60 * auVar121._4_4_ | (uint)!bVar60 * auVar120._4_4_;
      bVar60 = (bool)(bVar54 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar60 * auVar121._8_4_ | (uint)!bVar60 * auVar120._8_4_;
      bVar60 = (bool)(bVar54 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar60 * auVar121._12_4_ | (uint)!bVar60 * auVar120._12_4_;
      bVar60 = (bool)(bVar54 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar60 * auVar121._16_4_ | (uint)!bVar60 * auVar120._16_4_;
      bVar60 = (bool)(bVar54 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar60 * auVar121._20_4_ | (uint)!bVar60 * auVar120._20_4_;
      bVar60 = (bool)(bVar54 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar60 * auVar121._24_4_ | (uint)!bVar60 * auVar120._24_4_;
      auVar122._28_4_ =
           (uint)(bVar54 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar54 >> 7) * auVar120._28_4_;
      auVar120 = vmaxps_avx512vl(auVar107,auVar122);
      uVar17 = vcmpps_avx512vl(auVar108,auVar116,6);
      bVar54 = (byte)uVar16 | (byte)uVar17;
      auVar123._0_4_ = (uint)(bVar54 & 1) * 0x7f800000 | (uint)!(bool)(bVar54 & 1) * (int)fVar158;
      bVar60 = (bool)(bVar54 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar170;
      bVar60 = (bool)(bVar54 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar171;
      bVar60 = (bool)(bVar54 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar172;
      bVar60 = (bool)(bVar54 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar174;
      bVar60 = (bool)(bVar54 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar173;
      bVar60 = (bool)(bVar54 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar202;
      auVar123._28_4_ =
           (uint)(bVar54 >> 7) * 0x7f800000 | (uint)!(bool)(bVar54 >> 7) * auVar111._28_4_;
      auVar106 = vminps_avx512vl(auVar106,auVar123);
      auVar65 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar65),auVar97);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar65),auVar98);
      auVar107 = ZEXT1632(auVar65);
      auVar99 = vsubps_avx512vl(auVar107,auVar99);
      auVar99 = vmulps_avx512vl(auVar99,auVar105);
      auVar98 = vfmadd231ps_avx512vl(auVar99,auVar104,auVar98);
      auVar97 = vfmadd231ps_avx512vl(auVar98,auVar103,auVar97);
      auVar98 = vmulps_avx512vl(auVar84,auVar105);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_780,auVar104);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_760,auVar103);
      vandps_avx512vl(auVar98,auVar109);
      uVar16 = vcmpps_avx512vl(auVar98,auVar110,1);
      auVar97 = vxorps_avx512vl(auVar97,auVar92);
      auVar99 = vrcp14ps_avx512vl(auVar98);
      auVar103 = vxorps_avx512vl(auVar98,auVar92);
      auVar92 = vfnmadd213ps_avx512vl(auVar99,auVar98,auVar117);
      auVar65 = vfmadd132ps_fma(auVar92,auVar99,auVar99);
      fVar158 = auVar65._0_4_ * auVar97._0_4_;
      fVar170 = auVar65._4_4_ * auVar97._4_4_;
      auVar37._4_4_ = fVar170;
      auVar37._0_4_ = fVar158;
      fVar171 = auVar65._8_4_ * auVar97._8_4_;
      auVar37._8_4_ = fVar171;
      fVar172 = auVar65._12_4_ * auVar97._12_4_;
      auVar37._12_4_ = fVar172;
      fVar174 = auVar97._16_4_ * 0.0;
      auVar37._16_4_ = fVar174;
      fVar173 = auVar97._20_4_ * 0.0;
      auVar37._20_4_ = fVar173;
      fVar202 = auVar97._24_4_ * 0.0;
      auVar37._24_4_ = fVar202;
      auVar37._28_4_ = auVar97._28_4_;
      uVar17 = vcmpps_avx512vl(auVar98,auVar103,1);
      bVar54 = (byte)uVar16 | (byte)uVar17;
      auVar92 = vblendmps_avx512vl(auVar37,auVar238);
      auVar124._0_4_ =
           (uint)(bVar54 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar99._0_4_;
      bVar60 = (bool)(bVar54 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar60 * auVar92._4_4_ | (uint)!bVar60 * auVar99._4_4_;
      bVar60 = (bool)(bVar54 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar60 * auVar92._8_4_ | (uint)!bVar60 * auVar99._8_4_;
      bVar60 = (bool)(bVar54 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar60 * auVar92._12_4_ | (uint)!bVar60 * auVar99._12_4_;
      bVar60 = (bool)(bVar54 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar60 * auVar92._16_4_ | (uint)!bVar60 * auVar99._16_4_;
      bVar60 = (bool)(bVar54 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar60 * auVar92._20_4_ | (uint)!bVar60 * auVar99._20_4_;
      bVar60 = (bool)(bVar54 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar60 * auVar92._24_4_ | (uint)!bVar60 * auVar99._24_4_;
      auVar124._28_4_ =
           (uint)(bVar54 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar54 >> 7) * auVar99._28_4_;
      auVar92 = vmaxps_avx(auVar120,auVar124);
      uVar17 = vcmpps_avx512vl(auVar98,auVar103,6);
      bVar54 = (byte)uVar16 | (byte)uVar17;
      auVar125._0_4_ = (uint)(bVar54 & 1) * 0x7f800000 | (uint)!(bool)(bVar54 & 1) * (int)fVar158;
      bVar60 = (bool)(bVar54 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar170;
      bVar60 = (bool)(bVar54 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar171;
      bVar60 = (bool)(bVar54 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar172;
      bVar60 = (bool)(bVar54 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar174;
      bVar60 = (bool)(bVar54 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar173;
      bVar60 = (bool)(bVar54 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar60 * 0x7f800000 | (uint)!bVar60 * (int)fVar202;
      auVar125._28_4_ =
           (uint)(bVar54 >> 7) * 0x7f800000 | (uint)!(bool)(bVar54 >> 7) * auVar97._28_4_;
      local_640 = vminps_avx(auVar106,auVar125);
      uVar16 = vcmpps_avx512vl(auVar92,local_640,2);
      bVar48 = bVar48 & 0x7f & (byte)uVar16;
      if (bVar48 == 0) {
        auVar156 = ZEXT3264(auVar117);
        goto LAB_01ce8656;
      }
      auVar97 = vmaxps_avx512vl(auVar107,auVar79);
      auVar79 = vfmadd213ps_avx512vl(local_9c0,auVar113,auVar102);
      fVar158 = auVar100._0_4_;
      fVar170 = auVar100._4_4_;
      auVar38._4_4_ = fVar170 * auVar79._4_4_;
      auVar38._0_4_ = fVar158 * auVar79._0_4_;
      fVar171 = auVar100._8_4_;
      auVar38._8_4_ = fVar171 * auVar79._8_4_;
      fVar172 = auVar100._12_4_;
      auVar38._12_4_ = fVar172 * auVar79._12_4_;
      fVar174 = auVar100._16_4_;
      auVar38._16_4_ = fVar174 * auVar79._16_4_;
      fVar173 = auVar100._20_4_;
      auVar38._20_4_ = fVar173 * auVar79._20_4_;
      fVar202 = auVar100._24_4_;
      auVar38._24_4_ = fVar202 * auVar79._24_4_;
      auVar38._28_4_ = auVar79._28_4_;
      auVar79 = vfmadd213ps_avx512vl(local_7e0,auVar113,auVar102);
      auVar39._4_4_ = fVar170 * auVar79._4_4_;
      auVar39._0_4_ = fVar158 * auVar79._0_4_;
      auVar39._8_4_ = fVar171 * auVar79._8_4_;
      auVar39._12_4_ = fVar172 * auVar79._12_4_;
      auVar39._16_4_ = fVar174 * auVar79._16_4_;
      auVar39._20_4_ = fVar173 * auVar79._20_4_;
      auVar39._24_4_ = fVar202 * auVar79._24_4_;
      auVar39._28_4_ = auVar124._28_4_;
      auVar79 = vminps_avx512vl(auVar38,auVar117);
      auVar98 = ZEXT832(0) << 0x20;
      auVar79 = vmaxps_avx(auVar79,ZEXT832(0) << 0x20);
      auVar99 = vminps_avx512vl(auVar39,auVar117);
      auVar40._4_4_ = (auVar79._4_4_ + 1.0) * 0.125;
      auVar40._0_4_ = (auVar79._0_4_ + 0.0) * 0.125;
      auVar40._8_4_ = (auVar79._8_4_ + 2.0) * 0.125;
      auVar40._12_4_ = (auVar79._12_4_ + 3.0) * 0.125;
      auVar40._16_4_ = (auVar79._16_4_ + 4.0) * 0.125;
      auVar40._20_4_ = (auVar79._20_4_ + 5.0) * 0.125;
      auVar40._24_4_ = (auVar79._24_4_ + 6.0) * 0.125;
      auVar40._28_4_ = auVar79._28_4_ + 7.0;
      auVar65 = vfmadd213ps_fma(auVar40,auVar235,auVar214);
      local_520 = ZEXT1632(auVar65);
      auVar79 = vmaxps_avx(auVar99,ZEXT832(0) << 0x20);
      auVar41._4_4_ = (auVar79._4_4_ + 1.0) * 0.125;
      auVar41._0_4_ = (auVar79._0_4_ + 0.0) * 0.125;
      auVar41._8_4_ = (auVar79._8_4_ + 2.0) * 0.125;
      auVar41._12_4_ = (auVar79._12_4_ + 3.0) * 0.125;
      auVar41._16_4_ = (auVar79._16_4_ + 4.0) * 0.125;
      auVar41._20_4_ = (auVar79._20_4_ + 5.0) * 0.125;
      auVar41._24_4_ = (auVar79._24_4_ + 6.0) * 0.125;
      auVar41._28_4_ = auVar79._28_4_ + 7.0;
      auVar65 = vfmadd213ps_fma(auVar41,auVar235,auVar214);
      local_540 = ZEXT1632(auVar65);
      auVar42._4_4_ = auVar97._4_4_ * auVar97._4_4_;
      auVar42._0_4_ = auVar97._0_4_ * auVar97._0_4_;
      auVar42._8_4_ = auVar97._8_4_ * auVar97._8_4_;
      auVar42._12_4_ = auVar97._12_4_ * auVar97._12_4_;
      auVar42._16_4_ = auVar97._16_4_ * auVar97._16_4_;
      auVar42._20_4_ = auVar97._20_4_ * auVar97._20_4_;
      auVar42._24_4_ = auVar97._24_4_ * auVar97._24_4_;
      auVar42._28_4_ = auVar97._28_4_;
      auVar79 = vsubps_avx(auVar112,auVar42);
      auVar43._4_4_ = auVar79._4_4_ * (float)local_7c0._4_4_;
      auVar43._0_4_ = auVar79._0_4_ * (float)local_7c0._0_4_;
      auVar43._8_4_ = auVar79._8_4_ * fStack_7b8;
      auVar43._12_4_ = auVar79._12_4_ * fStack_7b4;
      auVar43._16_4_ = auVar79._16_4_ * fStack_7b0;
      auVar43._20_4_ = auVar79._20_4_ * fStack_7ac;
      auVar43._24_4_ = auVar79._24_4_ * fStack_7a8;
      auVar43._28_4_ = auVar97._28_4_;
      auVar97 = vsubps_avx(local_7a0,auVar43);
      uVar16 = vcmpps_avx512vl(auVar97,ZEXT832(0) << 0x20,5);
      bVar54 = (byte)uVar16;
      if (bVar54 == 0) {
        bVar54 = 0;
        auVar93 = ZEXT832(0) << 0x20;
        auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar97 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar126._8_4_ = 0x7f800000;
        auVar126._0_8_ = 0x7f8000007f800000;
        auVar126._12_4_ = 0x7f800000;
        auVar126._16_4_ = 0x7f800000;
        auVar126._20_4_ = 0x7f800000;
        auVar126._24_4_ = 0x7f800000;
        auVar126._28_4_ = 0x7f800000;
        auVar127._8_4_ = 0xff800000;
        auVar127._0_8_ = 0xff800000ff800000;
        auVar127._12_4_ = 0xff800000;
        auVar127._16_4_ = 0xff800000;
        auVar127._20_4_ = 0xff800000;
        auVar127._24_4_ = 0xff800000;
        auVar127._28_4_ = 0xff800000;
      }
      else {
        uVar62 = vcmpps_avx512vl(auVar97,auVar107,5);
        auVar97 = vsqrtps_avx(auVar97);
        auVar98 = vfnmadd213ps_avx512vl(auVar115,local_840,auVar117);
        auVar103 = vfmadd132ps_avx512vl(auVar98,local_840,local_840);
        auVar98 = vsubps_avx(local_980,auVar97);
        auVar104 = vmulps_avx512vl(auVar98,auVar103);
        auVar97 = vsubps_avx512vl(auVar97,auVar114);
        auVar105 = vmulps_avx512vl(auVar97,auVar103);
        auVar97 = vfmadd213ps_avx512vl(auVar113,auVar104,auVar102);
        auVar44._4_4_ = fVar170 * auVar97._4_4_;
        auVar44._0_4_ = fVar158 * auVar97._0_4_;
        auVar44._8_4_ = fVar171 * auVar97._8_4_;
        auVar44._12_4_ = fVar172 * auVar97._12_4_;
        auVar44._16_4_ = fVar174 * auVar97._16_4_;
        auVar44._20_4_ = fVar173 * auVar97._20_4_;
        auVar44._24_4_ = fVar202 * auVar97._24_4_;
        auVar44._28_4_ = auVar99._28_4_;
        auVar97 = vmulps_avx512vl(local_760,auVar104);
        auVar98 = vmulps_avx512vl(local_780,auVar104);
        auVar106 = vmulps_avx512vl(auVar84,auVar104);
        auVar99 = vfmadd213ps_avx512vl(auVar93,auVar44,auVar219);
        auVar99 = vsubps_avx512vl(auVar97,auVar99);
        auVar97 = vfmadd213ps_avx512vl(auVar94,auVar44,auVar96);
        auVar103 = vsubps_avx512vl(auVar98,auVar97);
        auVar65 = vfmadd213ps_fma(auVar44,auVar95,auVar101);
        auVar97 = vsubps_avx(auVar106,ZEXT1632(auVar65));
        auVar98 = vfmadd213ps_avx512vl(auVar113,auVar105,auVar102);
        auVar100 = vmulps_avx512vl(auVar100,auVar98);
        auVar98 = vmulps_avx512vl(local_760,auVar105);
        auVar102 = vmulps_avx512vl(local_780,auVar105);
        auVar106 = vmulps_avx512vl(auVar84,auVar105);
        auVar65 = vfmadd213ps_fma(auVar93,auVar100,auVar219);
        auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar65));
        auVar65 = vfmadd213ps_fma(auVar94,auVar100,auVar96);
        auVar93 = vsubps_avx512vl(auVar102,ZEXT1632(auVar65));
        auVar65 = vfmadd213ps_fma(auVar95,auVar100,auVar101);
        auVar94 = vsubps_avx512vl(auVar106,ZEXT1632(auVar65));
        auVar198._8_4_ = 0x7f800000;
        auVar198._0_8_ = 0x7f8000007f800000;
        auVar198._12_4_ = 0x7f800000;
        auVar198._16_4_ = 0x7f800000;
        auVar198._20_4_ = 0x7f800000;
        auVar198._24_4_ = 0x7f800000;
        auVar198._28_4_ = 0x7f800000;
        auVar95 = vblendmps_avx512vl(auVar198,auVar104);
        bVar60 = (bool)((byte)uVar62 & 1);
        auVar126._0_4_ = (uint)bVar60 * auVar95._0_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar60 * auVar95._4_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar60 * auVar95._8_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar60 * auVar95._12_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar60 * auVar95._16_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar60 * auVar95._20_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar60 * auVar95._24_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = SUB81(uVar62 >> 7,0);
        auVar126._28_4_ = (uint)bVar60 * auVar95._28_4_ | (uint)!bVar60 * 0x7f800000;
        auVar220._8_4_ = 0xff800000;
        auVar220._0_8_ = 0xff800000ff800000;
        auVar220._12_4_ = 0xff800000;
        auVar220._16_4_ = 0xff800000;
        auVar220._20_4_ = 0xff800000;
        auVar220._24_4_ = 0xff800000;
        auVar220._28_4_ = 0xff800000;
        auVar95 = vblendmps_avx512vl(auVar220,auVar105);
        bVar60 = (bool)((byte)uVar62 & 1);
        auVar127._0_4_ = (uint)bVar60 * auVar95._0_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar60 * auVar95._4_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar60 * auVar95._8_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar60 * auVar95._12_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar127._16_4_ = (uint)bVar60 * auVar95._16_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar127._20_4_ = (uint)bVar60 * auVar95._20_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar127._24_4_ = (uint)bVar60 * auVar95._24_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = SUB81(uVar62 >> 7,0);
        auVar127._28_4_ = (uint)bVar60 * auVar95._28_4_ | (uint)!bVar60 * -0x800000;
        auVar31._8_4_ = 0x36000000;
        auVar31._0_8_ = 0x3600000036000000;
        auVar31._12_4_ = 0x36000000;
        auVar31._16_4_ = 0x36000000;
        auVar31._20_4_ = 0x36000000;
        auVar31._24_4_ = 0x36000000;
        auVar31._28_4_ = 0x36000000;
        auVar95 = vmulps_avx512vl(local_800,auVar31);
        uVar51 = vcmpps_avx512vl(auVar95,local_820,0xe);
        uVar62 = uVar62 & uVar51;
        bVar55 = (byte)uVar62;
        if (bVar55 != 0) {
          uVar51 = vcmpps_avx512vl(auVar79,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar236._8_4_ = 0x7f800000;
          auVar236._0_8_ = 0x7f8000007f800000;
          auVar236._12_4_ = 0x7f800000;
          auVar236._16_4_ = 0x7f800000;
          auVar236._20_4_ = 0x7f800000;
          auVar236._24_4_ = 0x7f800000;
          auVar236._28_4_ = 0x7f800000;
          auVar239._8_4_ = 0xff800000;
          auVar239._0_8_ = 0xff800000ff800000;
          auVar239._12_4_ = 0xff800000;
          auVar239._16_4_ = 0xff800000;
          auVar239._20_4_ = 0xff800000;
          auVar239._24_4_ = 0xff800000;
          auVar239._28_4_ = 0xff800000;
          auVar79 = vblendmps_avx512vl(auVar236,auVar239);
          bVar57 = (byte)uVar51;
          uVar63 = (uint)(bVar57 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar95._0_4_;
          bVar60 = (bool)((byte)(uVar51 >> 1) & 1);
          uVar135 = (uint)bVar60 * auVar79._4_4_ | (uint)!bVar60 * auVar95._4_4_;
          bVar60 = (bool)((byte)(uVar51 >> 2) & 1);
          uVar136 = (uint)bVar60 * auVar79._8_4_ | (uint)!bVar60 * auVar95._8_4_;
          bVar60 = (bool)((byte)(uVar51 >> 3) & 1);
          uVar137 = (uint)bVar60 * auVar79._12_4_ | (uint)!bVar60 * auVar95._12_4_;
          bVar60 = (bool)((byte)(uVar51 >> 4) & 1);
          uVar138 = (uint)bVar60 * auVar79._16_4_ | (uint)!bVar60 * auVar95._16_4_;
          bVar60 = (bool)((byte)(uVar51 >> 5) & 1);
          uVar139 = (uint)bVar60 * auVar79._20_4_ | (uint)!bVar60 * auVar95._20_4_;
          bVar60 = (bool)((byte)(uVar51 >> 6) & 1);
          uVar140 = (uint)bVar60 * auVar79._24_4_ | (uint)!bVar60 * auVar95._24_4_;
          bVar60 = SUB81(uVar51 >> 7,0);
          uVar141 = (uint)bVar60 * auVar79._28_4_ | (uint)!bVar60 * auVar95._28_4_;
          auVar126._0_4_ = (bVar55 & 1) * uVar63 | !(bool)(bVar55 & 1) * auVar126._0_4_;
          bVar60 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar126._4_4_ = bVar60 * uVar135 | !bVar60 * auVar126._4_4_;
          bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar126._8_4_ = bVar60 * uVar136 | !bVar60 * auVar126._8_4_;
          bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar126._12_4_ = bVar60 * uVar137 | !bVar60 * auVar126._12_4_;
          bVar60 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar126._16_4_ = bVar60 * uVar138 | !bVar60 * auVar126._16_4_;
          bVar60 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar126._20_4_ = bVar60 * uVar139 | !bVar60 * auVar126._20_4_;
          bVar60 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar126._24_4_ = bVar60 * uVar140 | !bVar60 * auVar126._24_4_;
          bVar60 = SUB81(uVar62 >> 7,0);
          auVar126._28_4_ = bVar60 * uVar141 | !bVar60 * auVar126._28_4_;
          auVar79 = vblendmps_avx512vl(auVar239,auVar236);
          bVar60 = (bool)((byte)(uVar51 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar51 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar51 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar51 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar51 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar51 >> 6) & 1);
          bVar12 = SUB81(uVar51 >> 7,0);
          auVar127._0_4_ =
               (uint)(bVar55 & 1) *
               ((uint)(bVar57 & 1) * auVar79._0_4_ | !(bool)(bVar57 & 1) * uVar63) |
               !(bool)(bVar55 & 1) * auVar127._0_4_;
          bVar6 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar127._4_4_ =
               (uint)bVar6 * ((uint)bVar60 * auVar79._4_4_ | !bVar60 * uVar135) |
               !bVar6 * auVar127._4_4_;
          bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar127._8_4_ =
               (uint)bVar60 * ((uint)bVar7 * auVar79._8_4_ | !bVar7 * uVar136) |
               !bVar60 * auVar127._8_4_;
          bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar127._12_4_ =
               (uint)bVar60 * ((uint)bVar8 * auVar79._12_4_ | !bVar8 * uVar137) |
               !bVar60 * auVar127._12_4_;
          bVar60 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar127._16_4_ =
               (uint)bVar60 * ((uint)bVar9 * auVar79._16_4_ | !bVar9 * uVar138) |
               !bVar60 * auVar127._16_4_;
          bVar60 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar127._20_4_ =
               (uint)bVar60 * ((uint)bVar10 * auVar79._20_4_ | !bVar10 * uVar139) |
               !bVar60 * auVar127._20_4_;
          bVar60 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar127._24_4_ =
               (uint)bVar60 * ((uint)bVar11 * auVar79._24_4_ | !bVar11 * uVar140) |
               !bVar60 * auVar127._24_4_;
          bVar60 = SUB81(uVar62 >> 7,0);
          auVar127._28_4_ =
               (uint)bVar60 * ((uint)bVar12 * auVar79._28_4_ | !bVar12 * uVar141) |
               !bVar60 * auVar127._28_4_;
          bVar54 = (~bVar55 | bVar57) & bVar54;
        }
      }
      auVar79 = vmulps_avx512vl(auVar84,auVar94);
      auVar65 = vfmadd231ps_fma(auVar79,local_780,auVar93);
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),local_760,auVar98);
      auVar232._8_4_ = 0x7fffffff;
      auVar232._0_8_ = 0x7fffffff7fffffff;
      auVar232._12_4_ = 0x7fffffff;
      auVar232._16_4_ = 0x7fffffff;
      auVar232._20_4_ = 0x7fffffff;
      auVar232._24_4_ = 0x7fffffff;
      auVar232._28_4_ = 0x7fffffff;
      auVar79 = vandps_avx(ZEXT1632(auVar65),auVar232);
      _local_440 = auVar92;
      auVar228._8_4_ = 0x3e99999a;
      auVar228._0_8_ = 0x3e99999a3e99999a;
      auVar228._12_4_ = 0x3e99999a;
      auVar228._16_4_ = 0x3e99999a;
      auVar228._20_4_ = 0x3e99999a;
      auVar228._24_4_ = 0x3e99999a;
      auVar228._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar79,auVar228,1);
      local_6c0._0_2_ = (short)uVar16;
      local_660 = vmaxps_avx(auVar92,auVar127);
      auVar79 = vminps_avx(local_640,auVar126);
      uVar16 = vcmpps_avx512vl(auVar92,auVar79,2);
      bVar55 = (byte)uVar16 & bVar48;
      uVar17 = vcmpps_avx512vl(local_660,local_640,2);
      if ((bVar48 & ((byte)uVar17 | (byte)uVar16)) == 0) {
        auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar221 = ZEXT3264(local_8e0);
      }
      else {
        auVar79 = vmulps_avx512vl(auVar84,auVar97);
        auVar65 = vfmadd213ps_fma(auVar103,local_780,auVar79);
        auVar65 = vfmadd213ps_fma(auVar99,local_760,ZEXT1632(auVar65));
        auVar79 = vandps_avx(ZEXT1632(auVar65),auVar232);
        uVar16 = vcmpps_avx512vl(auVar79,auVar228,1);
        bVar57 = (byte)uVar16 | ~bVar54;
        auVar152._8_4_ = 2;
        auVar152._0_8_ = 0x200000002;
        auVar152._12_4_ = 2;
        auVar152._16_4_ = 2;
        auVar152._20_4_ = 2;
        auVar152._24_4_ = 2;
        auVar152._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar79 = vpblendmd_avx512vl(auVar152,auVar32);
        local_600._0_4_ = (uint)(bVar57 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
        bVar60 = (bool)(bVar57 >> 1 & 1);
        local_600._4_4_ = (uint)bVar60 * auVar79._4_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar57 >> 2 & 1);
        local_600._8_4_ = (uint)bVar60 * auVar79._8_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar57 >> 3 & 1);
        local_600._12_4_ = (uint)bVar60 * auVar79._12_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar57 >> 4 & 1);
        local_600._16_4_ = (uint)bVar60 * auVar79._16_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar57 >> 5 & 1);
        local_600._20_4_ = (uint)bVar60 * auVar79._20_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar57 >> 6 & 1);
        local_600._24_4_ = (uint)bVar60 * auVar79._24_4_ | (uint)!bVar60 * 2;
        local_600._28_4_ = (uint)(bVar57 >> 7) * auVar79._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2;
        local_680 = vpbroadcastd_avx512vl();
        uVar16 = vpcmpd_avx512vl(local_680,local_600,5);
        bVar57 = (byte)uVar16 & bVar55;
        auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        if (bVar57 == 0) {
          auVar154._4_4_ = uVar64;
          auVar154._0_4_ = uVar64;
          auVar154._8_4_ = uVar64;
          auVar154._12_4_ = uVar64;
          auVar154._16_4_ = uVar64;
          auVar154._20_4_ = uVar64;
          auVar154._24_4_ = uVar64;
          auVar154._28_4_ = uVar64;
          auVar79 = local_660;
        }
        else {
          local_620 = local_660;
          auVar1 = vminps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar65 = vmaxps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar68 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar73 = vminps_avx(auVar1,auVar68);
          auVar1 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar68 = vmaxps_avx(auVar65,auVar1);
          auVar77._8_4_ = 0x7fffffff;
          auVar77._0_8_ = 0x7fffffff7fffffff;
          auVar77._12_4_ = 0x7fffffff;
          auVar65 = vandps_avx(auVar73,auVar77);
          auVar1 = vandps_avx(auVar68,auVar77);
          auVar65 = vmaxps_avx(auVar65,auVar1);
          auVar1 = vmovshdup_avx(auVar65);
          auVar1 = vmaxss_avx(auVar1,auVar65);
          auVar65 = vshufpd_avx(auVar65,auVar65,1);
          auVar65 = vmaxss_avx(auVar65,auVar1);
          fVar158 = auVar65._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar68,auVar68,0xff);
          local_c60 = auVar92._0_4_;
          fStack_c5c = auVar92._4_4_;
          fStack_c58 = auVar92._8_4_;
          fStack_c54 = auVar92._12_4_;
          fStack_c50 = auVar92._16_4_;
          fStack_c4c = auVar92._20_4_;
          fStack_c48 = auVar92._24_4_;
          fStack_c44 = auVar92._28_4_;
          local_6a0 = local_c60 + fVar142;
          fStack_69c = fStack_c5c + fVar142;
          fStack_698 = fStack_c58 + fVar142;
          fStack_694 = fStack_c54 + fVar142;
          fStack_690 = fStack_c50 + fVar142;
          fStack_68c = fStack_c4c + fVar142;
          fStack_688 = fStack_c48 + fVar142;
          fStack_684 = fStack_c44 + fVar142;
          do {
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar79 = vblendmps_avx512vl(auVar153,auVar92);
            auVar129._0_4_ =
                 (uint)(bVar57 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar57 & 1) * 0x7f800000;
            bVar60 = (bool)(bVar57 >> 1 & 1);
            auVar129._4_4_ = (uint)bVar60 * auVar79._4_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar57 >> 2 & 1);
            auVar129._8_4_ = (uint)bVar60 * auVar79._8_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar57 >> 3 & 1);
            auVar129._12_4_ = (uint)bVar60 * auVar79._12_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar57 >> 4 & 1);
            auVar129._16_4_ = (uint)bVar60 * auVar79._16_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar57 >> 5 & 1);
            auVar129._20_4_ = (uint)bVar60 * auVar79._20_4_ | (uint)!bVar60 * 0x7f800000;
            auVar129._24_4_ =
                 (uint)(bVar57 >> 6) * auVar79._24_4_ | (uint)!(bool)(bVar57 >> 6) * 0x7f800000;
            auVar129._28_4_ = 0x7f800000;
            auVar79 = vshufps_avx(auVar129,auVar129,0xb1);
            auVar79 = vminps_avx(auVar129,auVar79);
            auVar93 = vshufpd_avx(auVar79,auVar79,5);
            auVar79 = vminps_avx(auVar79,auVar93);
            auVar93 = vpermpd_avx2(auVar79,0x4e);
            auVar79 = vminps_avx(auVar79,auVar93);
            uVar16 = vcmpps_avx512vl(auVar129,auVar79,0);
            bVar49 = (byte)uVar16 & bVar57;
            bVar50 = bVar57;
            if (bVar49 != 0) {
              bVar50 = bVar49;
            }
            iVar19 = 0;
            for (uVar64 = (uint)bVar50; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            uVar64 = *(uint *)(local_520 + (uint)(iVar19 << 2));
            uVar63 = *(uint *)(local_440 + (uint)(iVar19 << 2));
            fVar170 = auVar13._0_4_;
            if ((float)local_9a0._0_4_ < 0.0) {
              fVar170 = sqrtf((float)local_9a0._0_4_);
            }
            auVar65 = vinsertps_avx(ZEXT416(uVar63),ZEXT416(uVar64),0x10);
            auVar221 = ZEXT1664(auVar65);
            bVar60 = true;
            uVar62 = 0;
            do {
              uVar143 = auVar221._0_4_;
              auVar144._4_4_ = uVar143;
              auVar144._0_4_ = uVar143;
              auVar144._8_4_ = uVar143;
              auVar144._12_4_ = uVar143;
              auVar1 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_990);
              auVar68 = auVar221._0_16_;
              auVar65 = vmovshdup_avx(auVar68);
              local_7e0._0_16_ = auVar65;
              fVar202 = 1.0 - auVar65._0_4_;
              auVar65 = vshufps_avx(auVar68,auVar68,0x55);
              fVar171 = auVar65._0_4_;
              auVar177._0_4_ = local_8a0._0_4_ * fVar171;
              fVar172 = auVar65._4_4_;
              auVar177._4_4_ = local_8a0._4_4_ * fVar172;
              fVar174 = auVar65._8_4_;
              auVar177._8_4_ = local_8a0._8_4_ * fVar174;
              fVar173 = auVar65._12_4_;
              auVar177._12_4_ = local_8a0._12_4_ * fVar173;
              _local_7c0 = ZEXT416((uint)fVar202);
              auVar204._4_4_ = fVar202;
              auVar204._0_4_ = fVar202;
              auVar204._8_4_ = fVar202;
              auVar204._12_4_ = fVar202;
              auVar65 = vfmadd231ps_fma(auVar177,auVar204,local_860._0_16_);
              auVar215._0_4_ = local_880._0_4_ * fVar171;
              auVar215._4_4_ = local_880._4_4_ * fVar172;
              auVar215._8_4_ = local_880._8_4_ * fVar174;
              auVar215._12_4_ = local_880._12_4_ * fVar173;
              auVar68 = vfmadd231ps_fma(auVar215,auVar204,local_8a0._0_16_);
              auVar222._0_4_ = fVar171 * (float)local_8c0._0_4_;
              auVar222._4_4_ = fVar172 * (float)local_8c0._4_4_;
              auVar222._8_4_ = fVar174 * fStack_8b8;
              auVar222._12_4_ = fVar173 * fStack_8b4;
              auVar73 = vfmadd231ps_fma(auVar222,auVar204,local_880._0_16_);
              auVar229._0_4_ = fVar171 * auVar68._0_4_;
              auVar229._4_4_ = fVar172 * auVar68._4_4_;
              auVar229._8_4_ = fVar174 * auVar68._8_4_;
              auVar229._12_4_ = fVar173 * auVar68._12_4_;
              auVar65 = vfmadd231ps_fma(auVar229,auVar204,auVar65);
              auVar178._0_4_ = fVar171 * auVar73._0_4_;
              auVar178._4_4_ = fVar172 * auVar73._4_4_;
              auVar178._8_4_ = fVar174 * auVar73._8_4_;
              auVar178._12_4_ = fVar173 * auVar73._12_4_;
              auVar68 = vfmadd231ps_fma(auVar178,auVar204,auVar68);
              auVar216._0_4_ = fVar171 * auVar68._0_4_;
              auVar216._4_4_ = fVar172 * auVar68._4_4_;
              auVar216._8_4_ = fVar174 * auVar68._8_4_;
              auVar216._12_4_ = fVar173 * auVar68._12_4_;
              auVar73 = vfmadd231ps_fma(auVar216,auVar65,auVar204);
              auVar65 = vsubps_avx(auVar68,auVar65);
              auVar20._8_4_ = 0x40400000;
              auVar20._0_8_ = 0x4040000040400000;
              auVar20._12_4_ = 0x40400000;
              auVar68 = vmulps_avx512vl(auVar65,auVar20);
              local_7a0._0_16_ = auVar73;
              auVar1 = vsubps_avx(auVar1,auVar73);
              auVar65 = vdpps_avx(auVar1,auVar1,0x7f);
              fVar171 = auVar65._0_4_;
              local_740 = auVar221;
              if (fVar171 < 0.0) {
                auVar221._0_4_ = sqrtf(fVar171);
                auVar221._4_60_ = extraout_var;
                auVar73 = auVar221._0_16_;
              }
              else {
                auVar73 = vsqrtss_avx(auVar65,auVar65);
              }
              local_800._0_16_ = vdpps_avx(auVar68,auVar68,0x7f);
              fVar172 = local_800._0_4_;
              auVar179._4_12_ = ZEXT812(0) << 0x20;
              auVar179._0_4_ = fVar172;
              local_9c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
              fVar174 = local_9c0._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar66 = vxorps_avx512vl(local_800._0_16_,auVar21);
              auVar69 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar69._0_4_;
              local_980._0_4_ = auVar73._0_4_;
              if (fVar172 < auVar66._0_4_) {
                fVar173 = sqrtf(fVar172);
                auVar73 = ZEXT416((uint)local_980._0_4_);
              }
              else {
                auVar69 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar173 = auVar69._0_4_;
              }
              fVar202 = local_9c0._0_4_;
              fVar172 = fVar174 * 1.5 + fVar172 * -0.5 * fVar202 * fVar202 * fVar202;
              auVar145._0_4_ = auVar68._0_4_ * fVar172;
              auVar145._4_4_ = auVar68._4_4_ * fVar172;
              auVar145._8_4_ = auVar68._8_4_ * fVar172;
              auVar145._12_4_ = auVar68._12_4_ * fVar172;
              local_9c0._0_16_ = vdpps_avx(auVar1,auVar145,0x7f);
              auVar66 = vaddss_avx512f(auVar73,ZEXT416(0x3f800000));
              auVar146._0_4_ = local_9c0._0_4_ * local_9c0._0_4_;
              auVar146._4_4_ = local_9c0._4_4_ * local_9c0._4_4_;
              auVar146._8_4_ = local_9c0._8_4_ * local_9c0._8_4_;
              auVar146._12_4_ = local_9c0._12_4_ * local_9c0._12_4_;
              auVar65 = vsubps_avx(auVar65,auVar146);
              fVar174 = auVar65._0_4_;
              auVar160._4_12_ = ZEXT812(0) << 0x20;
              auVar160._0_4_ = fVar174;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar160);
              auVar70 = vmulss_avx512f(auVar69,ZEXT416(0x3fc00000));
              auVar71 = vmulss_avx512f(auVar65,ZEXT416(0xbf000000));
              uVar61 = fVar174 == 0.0;
              uVar59 = fVar174 < 0.0;
              if ((bool)uVar59) {
                local_900._0_4_ = fVar173;
                local_920._0_4_ = auVar70._0_4_;
                local_930._4_4_ = fVar172;
                local_930._0_4_ = fVar172;
                fStack_928 = fVar172;
                fStack_924 = fVar172;
                local_910 = auVar69;
                fVar174 = sqrtf(fVar174);
                auVar71 = ZEXT416(auVar71._0_4_);
                auVar70 = ZEXT416((uint)local_920._0_4_);
                auVar73 = ZEXT416((uint)local_980._0_4_);
                auVar66 = ZEXT416(auVar66._0_4_);
                auVar69 = local_910;
                fVar172 = (float)local_930._0_4_;
                fVar202 = (float)local_930._4_4_;
                fVar175 = fStack_928;
                fVar241 = fStack_924;
                fVar173 = (float)local_900._0_4_;
              }
              else {
                auVar65 = vsqrtss_avx(auVar65,auVar65);
                fVar174 = auVar65._0_4_;
                fVar202 = fVar172;
                fVar175 = fVar172;
                fVar241 = fVar172;
              }
              auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_);
              auVar65 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar176 = auVar65._0_4_ * 6.0;
              fVar14 = local_7e0._0_4_ * 6.0;
              auVar205._0_4_ = fVar14 * (float)local_8c0._0_4_;
              auVar205._4_4_ = fVar14 * (float)local_8c0._4_4_;
              auVar205._8_4_ = fVar14 * fStack_8b8;
              auVar205._12_4_ = fVar14 * fStack_8b4;
              auVar180._4_4_ = fVar176;
              auVar180._0_4_ = fVar176;
              auVar180._8_4_ = fVar176;
              auVar180._12_4_ = fVar176;
              auVar65 = vfmadd132ps_fma(auVar180,auVar205,local_880._0_16_);
              fVar176 = auVar74._0_4_ * 6.0;
              auVar161._4_4_ = fVar176;
              auVar161._0_4_ = fVar176;
              auVar161._8_4_ = fVar176;
              auVar161._12_4_ = fVar176;
              auVar65 = vfmadd132ps_fma(auVar161,auVar65,local_8a0._0_16_);
              fVar176 = local_7c0._0_4_ * 6.0;
              auVar181._4_4_ = fVar176;
              auVar181._0_4_ = fVar176;
              auVar181._8_4_ = fVar176;
              auVar181._12_4_ = fVar176;
              auVar65 = vfmadd132ps_fma(auVar181,auVar65,local_860._0_16_);
              auVar162._0_4_ = auVar65._0_4_ * (float)local_800._0_4_;
              auVar162._4_4_ = auVar65._4_4_ * (float)local_800._0_4_;
              auVar162._8_4_ = auVar65._8_4_ * (float)local_800._0_4_;
              auVar162._12_4_ = auVar65._12_4_ * (float)local_800._0_4_;
              auVar65 = vdpps_avx(auVar68,auVar65,0x7f);
              fVar176 = auVar65._0_4_;
              auVar182._0_4_ = auVar68._0_4_ * fVar176;
              auVar182._4_4_ = auVar68._4_4_ * fVar176;
              auVar182._8_4_ = auVar68._8_4_ * fVar176;
              auVar182._12_4_ = auVar68._12_4_ * fVar176;
              auVar65 = vsubps_avx(auVar162,auVar182);
              fVar176 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar74 = vmaxss_avx(ZEXT416((uint)fVar158),
                                   ZEXT416((uint)(local_740._0_4_ * fVar170 * 1.9073486e-06)));
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar72 = vxorps_avx512vl(auVar68,auVar22);
              auVar183._0_4_ = fVar172 * auVar65._0_4_ * fVar176;
              auVar183._4_4_ = fVar202 * auVar65._4_4_ * fVar176;
              auVar183._8_4_ = fVar175 * auVar65._8_4_ * fVar176;
              auVar183._12_4_ = fVar241 * auVar65._12_4_ * fVar176;
              auVar65 = vdpps_avx(auVar72,auVar145,0x7f);
              auVar75 = vfmadd213ss_fma(auVar73,ZEXT416((uint)fVar158),auVar74);
              auVar73 = vdpps_avx(auVar1,auVar183,0x7f);
              vfmadd213ss_avx512f(auVar66,ZEXT416((uint)(fVar158 / fVar173)),auVar75);
              fVar172 = auVar65._0_4_ + auVar73._0_4_;
              auVar65 = vdpps_avx(local_990,auVar145,0x7f);
              auVar73 = vdpps_avx(auVar1,auVar72,0x7f);
              auVar66 = vmulss_avx512f(auVar71,auVar69);
              auVar69 = vmulss_avx512f(auVar69,auVar69);
              auVar70 = vaddss_avx512f(auVar70,ZEXT416((uint)(auVar66._0_4_ * auVar69._0_4_)));
              auVar69 = vdpps_avx(auVar1,local_990,0x7f);
              auVar71 = vfnmadd231ss_avx512f(auVar73,local_9c0._0_16_,ZEXT416((uint)fVar172));
              auVar69 = vfnmadd231ss_avx512f(auVar69,local_9c0._0_16_,auVar65);
              auVar73 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar174 = fVar174 - auVar73._0_4_;
              auVar66 = vshufps_avx(auVar68,auVar68,0xff);
              auVar73 = vfmsub213ss_fma(auVar71,auVar70,auVar66);
              auVar233._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
              auVar233._8_4_ = auVar73._8_4_ ^ 0x80000000;
              auVar233._12_4_ = auVar73._12_4_ ^ 0x80000000;
              auVar69 = ZEXT416((uint)(auVar69._0_4_ * auVar70._0_4_));
              auVar70 = vfmsub231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar73._0_4_)),
                                        ZEXT416((uint)fVar172),auVar69);
              auVar73 = vinsertps_avx(auVar233,auVar69,0x1c);
              auVar223._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
              auVar223._8_4_ = auVar65._8_4_ ^ 0x80000000;
              auVar223._12_4_ = auVar65._12_4_ ^ 0x80000000;
              auVar69 = vinsertps_avx(ZEXT416((uint)fVar172),auVar223,0x10);
              auVar206._0_4_ = auVar70._0_4_;
              auVar206._4_4_ = auVar206._0_4_;
              auVar206._8_4_ = auVar206._0_4_;
              auVar206._12_4_ = auVar206._0_4_;
              auVar65 = vdivps_avx(auVar73,auVar206);
              auVar73 = vdivps_avx(auVar69,auVar206);
              auVar69 = vbroadcastss_avx512vl(local_9c0._0_16_);
              auVar207._0_4_ = auVar69._0_4_ * auVar65._0_4_ + fVar174 * auVar73._0_4_;
              auVar207._4_4_ = auVar69._4_4_ * auVar65._4_4_ + fVar174 * auVar73._4_4_;
              auVar207._8_4_ = auVar69._8_4_ * auVar65._8_4_ + fVar174 * auVar73._8_4_;
              auVar207._12_4_ = auVar69._12_4_ * auVar65._12_4_ + fVar174 * auVar73._12_4_;
              auVar65 = vsubps_avx(local_740._0_16_,auVar207);
              auVar221 = ZEXT1664(auVar65);
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar73 = vandps_avx512vl(local_9c0._0_16_,auVar23);
              auVar73 = vucomiss_avx512f(auVar73);
              if (!(bool)uVar59 && !(bool)uVar61) {
                auVar73 = vaddss_avx512f(auVar74,auVar73);
                auVar73 = vfmadd231ss_fma(auVar73,local_940,ZEXT416(0x36000000));
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar69 = vandps_avx512vl(ZEXT416((uint)fVar174),auVar24);
                if (auVar69._0_4_ < auVar73._0_4_) {
                  fVar170 = auVar65._0_4_ + (float)local_950._0_4_;
                  auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar170 < fVar203) {
                    bVar50 = 0;
                    goto LAB_01ce94fe;
                  }
                  fVar172 = *(float *)(ray + k * 4 + 0x200);
                  if (fVar170 <= fVar172) {
                    auVar65 = vmovshdup_avx(auVar65);
                    bVar50 = 0;
                    if ((auVar65._0_4_ < 0.0) || (1.0 < auVar65._0_4_)) goto LAB_01ce94fe;
                    auVar208._0_12_ = ZEXT812(0);
                    auVar208._12_4_ = 0;
                    auVar184._4_8_ = auVar208._4_8_;
                    auVar184._0_4_ = fVar171;
                    auVar184._12_4_ = 0;
                    auVar65 = vrsqrt14ss_avx512f(auVar208,auVar184);
                    fVar174 = auVar65._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar58].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                      bVar50 = 0;
                      goto LAB_01ce94fe;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar50 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01ce94fe;
                    fVar171 = fVar174 * 1.5 + fVar171 * -0.5 * fVar174 * fVar174 * fVar174;
                    auVar185._0_4_ = auVar1._0_4_ * fVar171;
                    auVar185._4_4_ = auVar1._4_4_ * fVar171;
                    auVar185._8_4_ = auVar1._8_4_ * fVar171;
                    auVar185._12_4_ = auVar1._12_4_ * fVar171;
                    auVar73 = vfmadd213ps_fma(auVar66,auVar185,auVar68);
                    auVar65 = vshufps_avx(auVar185,auVar185,0xc9);
                    auVar1 = vshufps_avx(auVar68,auVar68,0xc9);
                    auVar186._0_4_ = auVar185._0_4_ * auVar1._0_4_;
                    auVar186._4_4_ = auVar185._4_4_ * auVar1._4_4_;
                    auVar186._8_4_ = auVar185._8_4_ * auVar1._8_4_;
                    auVar186._12_4_ = auVar185._12_4_ * auVar1._12_4_;
                    auVar68 = vfmsub231ps_fma(auVar186,auVar68,auVar65);
                    auVar65 = vshufps_avx(auVar68,auVar68,0xc9);
                    auVar1 = vshufps_avx(auVar73,auVar73,0xc9);
                    auVar68 = vshufps_avx(auVar68,auVar68,0xd2);
                    auVar147._0_4_ = auVar73._0_4_ * auVar68._0_4_;
                    auVar147._4_4_ = auVar73._4_4_ * auVar68._4_4_;
                    auVar147._8_4_ = auVar73._8_4_ * auVar68._8_4_;
                    auVar147._12_4_ = auVar73._12_4_ * auVar68._12_4_;
                    auVar65 = vfmsub231ps_fma(auVar147,auVar65,auVar1);
                    auVar133 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar133,auVar221);
                    auVar221 = vpermps_avx512f(auVar133,ZEXT1664(auVar65));
                    auVar133 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar133,ZEXT1664(auVar65));
                    local_380 = vbroadcastss_avx512f(auVar65);
                    local_400[0] = (RTCHitN)auVar221[0];
                    local_400[1] = (RTCHitN)auVar221[1];
                    local_400[2] = (RTCHitN)auVar221[2];
                    local_400[3] = (RTCHitN)auVar221[3];
                    local_400[4] = (RTCHitN)auVar221[4];
                    local_400[5] = (RTCHitN)auVar221[5];
                    local_400[6] = (RTCHitN)auVar221[6];
                    local_400[7] = (RTCHitN)auVar221[7];
                    local_400[8] = (RTCHitN)auVar221[8];
                    local_400[9] = (RTCHitN)auVar221[9];
                    local_400[10] = (RTCHitN)auVar221[10];
                    local_400[0xb] = (RTCHitN)auVar221[0xb];
                    local_400[0xc] = (RTCHitN)auVar221[0xc];
                    local_400[0xd] = (RTCHitN)auVar221[0xd];
                    local_400[0xe] = (RTCHitN)auVar221[0xe];
                    local_400[0xf] = (RTCHitN)auVar221[0xf];
                    local_400[0x10] = (RTCHitN)auVar221[0x10];
                    local_400[0x11] = (RTCHitN)auVar221[0x11];
                    local_400[0x12] = (RTCHitN)auVar221[0x12];
                    local_400[0x13] = (RTCHitN)auVar221[0x13];
                    local_400[0x14] = (RTCHitN)auVar221[0x14];
                    local_400[0x15] = (RTCHitN)auVar221[0x15];
                    local_400[0x16] = (RTCHitN)auVar221[0x16];
                    local_400[0x17] = (RTCHitN)auVar221[0x17];
                    local_400[0x18] = (RTCHitN)auVar221[0x18];
                    local_400[0x19] = (RTCHitN)auVar221[0x19];
                    local_400[0x1a] = (RTCHitN)auVar221[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar221[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar221[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar221[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar221[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar221[0x1f];
                    local_400[0x20] = (RTCHitN)auVar221[0x20];
                    local_400[0x21] = (RTCHitN)auVar221[0x21];
                    local_400[0x22] = (RTCHitN)auVar221[0x22];
                    local_400[0x23] = (RTCHitN)auVar221[0x23];
                    local_400[0x24] = (RTCHitN)auVar221[0x24];
                    local_400[0x25] = (RTCHitN)auVar221[0x25];
                    local_400[0x26] = (RTCHitN)auVar221[0x26];
                    local_400[0x27] = (RTCHitN)auVar221[0x27];
                    local_400[0x28] = (RTCHitN)auVar221[0x28];
                    local_400[0x29] = (RTCHitN)auVar221[0x29];
                    local_400[0x2a] = (RTCHitN)auVar221[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar221[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar221[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar221[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar221[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar221[0x2f];
                    local_400[0x30] = (RTCHitN)auVar221[0x30];
                    local_400[0x31] = (RTCHitN)auVar221[0x31];
                    local_400[0x32] = (RTCHitN)auVar221[0x32];
                    local_400[0x33] = (RTCHitN)auVar221[0x33];
                    local_400[0x34] = (RTCHitN)auVar221[0x34];
                    local_400[0x35] = (RTCHitN)auVar221[0x35];
                    local_400[0x36] = (RTCHitN)auVar221[0x36];
                    local_400[0x37] = (RTCHitN)auVar221[0x37];
                    local_400[0x38] = (RTCHitN)auVar221[0x38];
                    local_400[0x39] = (RTCHitN)auVar221[0x39];
                    local_400[0x3a] = (RTCHitN)auVar221[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar221[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar221[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar221[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar221[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar221[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar221 = vmovdqa64_avx512f(local_4c0);
                    local_280 = vmovdqa64_avx512f(auVar221);
                    vpcmpeqd_avx2(auVar221._0_32_,auVar221._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar170;
                    auVar221 = vmovdqa64_avx512f(local_500);
                    local_700 = vmovdqa64_avx512f(auVar221);
                    local_9f0.valid = (int *)local_700;
                    local_9f0.geometryUserPtr = pGVar3->userPtr;
                    local_9f0.context = context->user;
                    local_9f0.hit = local_400;
                    local_9f0.N = 0x10;
                    local_9f0.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&local_9f0);
                      auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      auVar221 = vmovdqa64_avx512f(local_700);
                    }
                    uVar16 = vptestmd_avx512f(auVar221,auVar221);
                    if ((short)uVar16 != 0) {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&local_9f0);
                        auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        auVar221 = vmovdqa64_avx512f(local_700);
                      }
                      uVar62 = vptestmd_avx512f(auVar221,auVar221);
                      auVar221 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar6 = (bool)((byte)uVar62 & 1);
                      auVar133._0_4_ =
                           (uint)bVar6 * auVar221._0_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x200);
                      bVar6 = (bool)((byte)(uVar62 >> 1) & 1);
                      auVar133._4_4_ =
                           (uint)bVar6 * auVar221._4_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x204);
                      bVar6 = (bool)((byte)(uVar62 >> 2) & 1);
                      auVar133._8_4_ =
                           (uint)bVar6 * auVar221._8_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x208);
                      bVar6 = (bool)((byte)(uVar62 >> 3) & 1);
                      auVar133._12_4_ =
                           (uint)bVar6 * auVar221._12_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x20c);
                      bVar6 = (bool)((byte)(uVar62 >> 4) & 1);
                      auVar133._16_4_ =
                           (uint)bVar6 * auVar221._16_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x210);
                      bVar6 = (bool)((byte)(uVar62 >> 5) & 1);
                      auVar133._20_4_ =
                           (uint)bVar6 * auVar221._20_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x214);
                      bVar6 = (bool)((byte)(uVar62 >> 6) & 1);
                      auVar133._24_4_ =
                           (uint)bVar6 * auVar221._24_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x218);
                      bVar6 = (bool)((byte)(uVar62 >> 7) & 1);
                      auVar133._28_4_ =
                           (uint)bVar6 * auVar221._28_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x21c);
                      bVar6 = (bool)((byte)(uVar62 >> 8) & 1);
                      auVar133._32_4_ =
                           (uint)bVar6 * auVar221._32_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x220);
                      bVar6 = (bool)((byte)(uVar62 >> 9) & 1);
                      auVar133._36_4_ =
                           (uint)bVar6 * auVar221._36_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x224);
                      bVar6 = (bool)((byte)(uVar62 >> 10) & 1);
                      auVar133._40_4_ =
                           (uint)bVar6 * auVar221._40_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x228);
                      bVar6 = (bool)((byte)(uVar62 >> 0xb) & 1);
                      auVar133._44_4_ =
                           (uint)bVar6 * auVar221._44_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x22c);
                      bVar6 = (bool)((byte)(uVar62 >> 0xc) & 1);
                      auVar133._48_4_ =
                           (uint)bVar6 * auVar221._48_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x230);
                      bVar6 = (bool)((byte)(uVar62 >> 0xd) & 1);
                      auVar133._52_4_ =
                           (uint)bVar6 * auVar221._52_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x234);
                      bVar6 = (bool)((byte)(uVar62 >> 0xe) & 1);
                      auVar133._56_4_ =
                           (uint)bVar6 * auVar221._56_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x238);
                      bVar6 = SUB81(uVar62 >> 0xf,0);
                      auVar133._60_4_ =
                           (uint)bVar6 * auVar221._60_4_ |
                           (uint)!bVar6 * *(int *)(local_9f0.ray + 0x23c);
                      *(undefined1 (*) [64])(local_9f0.ray + 0x200) = auVar133;
                      bVar50 = 1;
                      if ((short)uVar62 != 0) goto LAB_01ce94fe;
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar172;
                  }
                  bVar50 = 0;
                  goto LAB_01ce94fe;
                }
              }
              bVar60 = uVar62 < 4;
              uVar62 = uVar62 + 1;
            } while (uVar62 != 5);
            bVar60 = false;
            auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar50 = 5;
LAB_01ce94fe:
            bVar56 = (bool)(bVar56 | bVar60 & bVar50);
            uVar143 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar154._4_4_ = uVar143;
            auVar154._0_4_ = uVar143;
            auVar154._8_4_ = uVar143;
            auVar154._12_4_ = uVar143;
            auVar154._16_4_ = uVar143;
            auVar154._20_4_ = uVar143;
            auVar154._24_4_ = uVar143;
            auVar154._28_4_ = uVar143;
            auVar45._4_4_ = fStack_69c;
            auVar45._0_4_ = local_6a0;
            auVar45._8_4_ = fStack_698;
            auVar45._12_4_ = fStack_694;
            auVar45._16_4_ = fStack_690;
            auVar45._20_4_ = fStack_68c;
            auVar45._24_4_ = fStack_688;
            auVar45._28_4_ = fStack_684;
            uVar16 = vcmpps_avx512vl(auVar154,auVar45,0xd);
            bVar57 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar57 & (byte)uVar16;
            auVar79 = local_620;
          } while (bVar57 != 0);
        }
        auVar92 = local_660;
        bVar54 = local_6c0[0] | ~bVar54;
        auVar168._0_4_ = fVar142 + auVar79._0_4_;
        auVar168._4_4_ = fVar142 + auVar79._4_4_;
        auVar168._8_4_ = fVar142 + auVar79._8_4_;
        auVar168._12_4_ = fVar142 + auVar79._12_4_;
        auVar168._16_4_ = fVar142 + auVar79._16_4_;
        auVar168._20_4_ = fVar142 + auVar79._20_4_;
        auVar168._24_4_ = fVar142 + auVar79._24_4_;
        auVar168._28_4_ = fVar142 + auVar79._28_4_;
        uVar16 = vcmpps_avx512vl(auVar168,auVar154,2);
        bVar48 = (byte)uVar17 & bVar48 & (byte)uVar16;
        auVar169._8_4_ = 2;
        auVar169._0_8_ = 0x200000002;
        auVar169._12_4_ = 2;
        auVar169._16_4_ = 2;
        auVar169._20_4_ = 2;
        auVar169._24_4_ = 2;
        auVar169._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar79 = vpblendmd_avx512vl(auVar169,auVar33);
        auVar130._0_4_ = (uint)(bVar54 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar54 & 1) * 2;
        bVar60 = (bool)(bVar54 >> 1 & 1);
        auVar130._4_4_ = (uint)bVar60 * auVar79._4_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 2 & 1);
        auVar130._8_4_ = (uint)bVar60 * auVar79._8_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 3 & 1);
        auVar130._12_4_ = (uint)bVar60 * auVar79._12_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 4 & 1);
        auVar130._16_4_ = (uint)bVar60 * auVar79._16_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 5 & 1);
        auVar130._20_4_ = (uint)bVar60 * auVar79._20_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 6 & 1);
        auVar130._24_4_ = (uint)bVar60 * auVar79._24_4_ | (uint)!bVar60 * 2;
        auVar130._28_4_ = (uint)(bVar54 >> 7) * auVar79._28_4_ | (uint)!(bool)(bVar54 >> 7) * 2;
        uVar16 = vpcmpd_avx512vl(local_680,auVar130,5);
        bVar54 = (byte)uVar16 & bVar48;
        if (bVar54 != 0) {
          auVar1 = vminps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar65 = vmaxps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar68 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar73 = vminps_avx(auVar1,auVar68);
          auVar1 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar68 = vmaxps_avx(auVar65,auVar1);
          auVar187._8_4_ = 0x7fffffff;
          auVar187._0_8_ = 0x7fffffff7fffffff;
          auVar187._12_4_ = 0x7fffffff;
          auVar65 = vandps_avx(auVar73,auVar187);
          auVar1 = vandps_avx(auVar68,auVar187);
          auVar65 = vmaxps_avx(auVar65,auVar1);
          auVar1 = vmovshdup_avx(auVar65);
          auVar1 = vmaxss_avx(auVar1,auVar65);
          auVar65 = vshufpd_avx(auVar65,auVar65,1);
          auVar65 = vmaxss_avx(auVar65,auVar1);
          fVar158 = auVar65._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar68,auVar68,0xff);
          local_6a0 = fVar142 + local_660._0_4_;
          fStack_69c = fVar142 + local_660._4_4_;
          fStack_698 = fVar142 + local_660._8_4_;
          fStack_694 = fVar142 + local_660._12_4_;
          fStack_690 = fVar142 + local_660._16_4_;
          fStack_68c = fVar142 + local_660._20_4_;
          fStack_688 = fVar142 + local_660._24_4_;
          fStack_684 = fVar142 + local_660._28_4_;
          local_6c0 = auVar130;
          do {
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar79 = vblendmps_avx512vl(auVar155,auVar92);
            auVar131._0_4_ =
                 (uint)(bVar54 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar54 & 1) * 0x7f800000;
            bVar60 = (bool)(bVar54 >> 1 & 1);
            auVar131._4_4_ = (uint)bVar60 * auVar79._4_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar54 >> 2 & 1);
            auVar131._8_4_ = (uint)bVar60 * auVar79._8_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar54 >> 3 & 1);
            auVar131._12_4_ = (uint)bVar60 * auVar79._12_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar54 >> 4 & 1);
            auVar131._16_4_ = (uint)bVar60 * auVar79._16_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar54 >> 5 & 1);
            auVar131._20_4_ = (uint)bVar60 * auVar79._20_4_ | (uint)!bVar60 * 0x7f800000;
            auVar131._24_4_ =
                 (uint)(bVar54 >> 6) * auVar79._24_4_ | (uint)!(bool)(bVar54 >> 6) * 0x7f800000;
            auVar131._28_4_ = 0x7f800000;
            auVar79 = vshufps_avx(auVar131,auVar131,0xb1);
            auVar79 = vminps_avx(auVar131,auVar79);
            auVar93 = vshufpd_avx(auVar79,auVar79,5);
            auVar79 = vminps_avx(auVar79,auVar93);
            auVar93 = vpermpd_avx2(auVar79,0x4e);
            auVar79 = vminps_avx(auVar79,auVar93);
            uVar16 = vcmpps_avx512vl(auVar131,auVar79,0);
            bVar50 = (byte)uVar16 & bVar54;
            bVar57 = bVar54;
            if (bVar50 != 0) {
              bVar57 = bVar50;
            }
            iVar19 = 0;
            for (uVar64 = (uint)bVar57; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            uVar64 = *(uint *)(local_540 + (uint)(iVar19 << 2));
            uVar63 = *(uint *)(local_640 + (uint)(iVar19 << 2));
            fVar170 = auVar67._0_4_;
            if ((float)local_9a0._0_4_ < 0.0) {
              fVar170 = sqrtf((float)local_9a0._0_4_);
            }
            auVar65 = vinsertps_avx(ZEXT416(uVar63),ZEXT416(uVar64),0x10);
            auVar221 = ZEXT1664(auVar65);
            bVar60 = true;
            uVar62 = 0;
            do {
              uVar143 = auVar221._0_4_;
              auVar148._4_4_ = uVar143;
              auVar148._0_4_ = uVar143;
              auVar148._8_4_ = uVar143;
              auVar148._12_4_ = uVar143;
              auVar1 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_990);
              auVar68 = auVar221._0_16_;
              auVar65 = vmovshdup_avx(auVar68);
              local_7e0._0_16_ = auVar65;
              fVar202 = 1.0 - auVar65._0_4_;
              auVar65 = vshufps_avx(auVar68,auVar68,0x55);
              fVar171 = auVar65._0_4_;
              auVar188._0_4_ = local_8a0._0_4_ * fVar171;
              fVar172 = auVar65._4_4_;
              auVar188._4_4_ = local_8a0._4_4_ * fVar172;
              fVar174 = auVar65._8_4_;
              auVar188._8_4_ = local_8a0._8_4_ * fVar174;
              fVar173 = auVar65._12_4_;
              auVar188._12_4_ = local_8a0._12_4_ * fVar173;
              _local_7c0 = ZEXT416((uint)fVar202);
              auVar209._4_4_ = fVar202;
              auVar209._0_4_ = fVar202;
              auVar209._8_4_ = fVar202;
              auVar209._12_4_ = fVar202;
              auVar65 = vfmadd231ps_fma(auVar188,auVar209,local_860._0_16_);
              auVar217._0_4_ = local_880._0_4_ * fVar171;
              auVar217._4_4_ = local_880._4_4_ * fVar172;
              auVar217._8_4_ = local_880._8_4_ * fVar174;
              auVar217._12_4_ = local_880._12_4_ * fVar173;
              auVar68 = vfmadd231ps_fma(auVar217,auVar209,local_8a0._0_16_);
              auVar224._0_4_ = fVar171 * (float)local_8c0._0_4_;
              auVar224._4_4_ = fVar172 * (float)local_8c0._4_4_;
              auVar224._8_4_ = fVar174 * fStack_8b8;
              auVar224._12_4_ = fVar173 * fStack_8b4;
              auVar73 = vfmadd231ps_fma(auVar224,auVar209,local_880._0_16_);
              auVar230._0_4_ = fVar171 * auVar68._0_4_;
              auVar230._4_4_ = fVar172 * auVar68._4_4_;
              auVar230._8_4_ = fVar174 * auVar68._8_4_;
              auVar230._12_4_ = fVar173 * auVar68._12_4_;
              auVar65 = vfmadd231ps_fma(auVar230,auVar209,auVar65);
              auVar189._0_4_ = fVar171 * auVar73._0_4_;
              auVar189._4_4_ = fVar172 * auVar73._4_4_;
              auVar189._8_4_ = fVar174 * auVar73._8_4_;
              auVar189._12_4_ = fVar173 * auVar73._12_4_;
              auVar68 = vfmadd231ps_fma(auVar189,auVar209,auVar68);
              auVar218._0_4_ = fVar171 * auVar68._0_4_;
              auVar218._4_4_ = fVar172 * auVar68._4_4_;
              auVar218._8_4_ = fVar174 * auVar68._8_4_;
              auVar218._12_4_ = fVar173 * auVar68._12_4_;
              auVar73 = vfmadd231ps_fma(auVar218,auVar65,auVar209);
              auVar65 = vsubps_avx(auVar68,auVar65);
              auVar25._8_4_ = 0x40400000;
              auVar25._0_8_ = 0x4040000040400000;
              auVar25._12_4_ = 0x40400000;
              auVar68 = vmulps_avx512vl(auVar65,auVar25);
              local_7a0._0_16_ = auVar73;
              auVar1 = vsubps_avx(auVar1,auVar73);
              auVar65 = vdpps_avx(auVar1,auVar1,0x7f);
              fVar171 = auVar65._0_4_;
              local_740 = auVar221;
              if (fVar171 < 0.0) {
                auVar157._0_4_ = sqrtf(fVar171);
                auVar157._4_60_ = extraout_var_00;
                auVar73 = auVar157._0_16_;
              }
              else {
                auVar73 = vsqrtss_avx(auVar65,auVar65);
              }
              local_800._0_16_ = vdpps_avx(auVar68,auVar68,0x7f);
              fVar172 = local_800._0_4_;
              auVar190._4_12_ = ZEXT812(0) << 0x20;
              auVar190._0_4_ = fVar172;
              local_9c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              fVar174 = local_9c0._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar66 = vxorps_avx512vl(local_800._0_16_,auVar26);
              auVar69 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar69._0_4_;
              local_980._0_4_ = auVar73._0_4_;
              if (fVar172 < auVar66._0_4_) {
                fVar173 = sqrtf(fVar172);
                auVar73 = ZEXT416((uint)local_980._0_4_);
              }
              else {
                auVar69 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar173 = auVar69._0_4_;
              }
              fVar202 = local_9c0._0_4_;
              auVar66 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar174 * 1.5 +
                                                 fVar172 * -0.5 * fVar202 * fVar202 * fVar202)));
              auVar69 = vmulps_avx512vl(auVar68,auVar66);
              local_9c0._0_16_ = vdpps_avx(auVar1,auVar69,0x7f);
              auVar71 = vaddss_avx512f(auVar73,ZEXT416(0x3f800000));
              auVar149._0_4_ = local_9c0._0_4_ * local_9c0._0_4_;
              auVar149._4_4_ = local_9c0._4_4_ * local_9c0._4_4_;
              auVar149._8_4_ = local_9c0._8_4_ * local_9c0._8_4_;
              auVar149._12_4_ = local_9c0._12_4_ * local_9c0._12_4_;
              auVar65 = vsubps_avx(auVar65,auVar149);
              fVar172 = auVar65._0_4_;
              auVar163._4_12_ = ZEXT812(0) << 0x20;
              auVar163._0_4_ = fVar172;
              auVar70 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar163);
              auVar74 = vmulss_avx512f(auVar70,ZEXT416(0x3fc00000));
              auVar75 = vmulss_avx512f(auVar65,ZEXT416(0xbf000000));
              uVar61 = fVar172 == 0.0;
              uVar59 = fVar172 < 0.0;
              if ((bool)uVar59) {
                local_910._0_4_ = auVar74._0_4_;
                _local_930 = auVar66;
                local_920 = auVar69;
                local_900 = auVar70;
                fVar172 = sqrtf(fVar172);
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar74 = ZEXT416((uint)local_910._0_4_);
                auVar73 = ZEXT416((uint)local_980._0_4_);
                auVar71 = ZEXT416(auVar71._0_4_);
                auVar69 = local_920;
                auVar70 = local_900;
                auVar66 = _local_930;
              }
              else {
                auVar65 = vsqrtss_avx(auVar65,auVar65);
                fVar172 = auVar65._0_4_;
              }
              auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_);
              auVar65 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar174 = auVar65._0_4_ * 6.0;
              fVar202 = local_7e0._0_4_ * 6.0;
              auVar210._0_4_ = fVar202 * (float)local_8c0._0_4_;
              auVar210._4_4_ = fVar202 * (float)local_8c0._4_4_;
              auVar210._8_4_ = fVar202 * fStack_8b8;
              auVar210._12_4_ = fVar202 * fStack_8b4;
              auVar191._4_4_ = fVar174;
              auVar191._0_4_ = fVar174;
              auVar191._8_4_ = fVar174;
              auVar191._12_4_ = fVar174;
              auVar65 = vfmadd132ps_fma(auVar191,auVar210,local_880._0_16_);
              fVar174 = auVar72._0_4_ * 6.0;
              auVar164._4_4_ = fVar174;
              auVar164._0_4_ = fVar174;
              auVar164._8_4_ = fVar174;
              auVar164._12_4_ = fVar174;
              auVar65 = vfmadd132ps_fma(auVar164,auVar65,local_8a0._0_16_);
              fVar174 = local_7c0._0_4_ * 6.0;
              auVar192._4_4_ = fVar174;
              auVar192._0_4_ = fVar174;
              auVar192._8_4_ = fVar174;
              auVar192._12_4_ = fVar174;
              auVar65 = vfmadd132ps_fma(auVar192,auVar65,local_860._0_16_);
              auVar165._0_4_ = auVar65._0_4_ * (float)local_800._0_4_;
              auVar165._4_4_ = auVar65._4_4_ * (float)local_800._0_4_;
              auVar165._8_4_ = auVar65._8_4_ * (float)local_800._0_4_;
              auVar165._12_4_ = auVar65._12_4_ * (float)local_800._0_4_;
              auVar65 = vdpps_avx(auVar68,auVar65,0x7f);
              fVar174 = auVar65._0_4_;
              auVar193._0_4_ = auVar68._0_4_ * fVar174;
              auVar193._4_4_ = auVar68._4_4_ * fVar174;
              auVar193._8_4_ = auVar68._8_4_ * fVar174;
              auVar193._12_4_ = auVar68._12_4_ * fVar174;
              auVar65 = vsubps_avx(auVar165,auVar193);
              fVar174 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar72 = vmaxss_avx(ZEXT416((uint)fVar158),
                                   ZEXT416((uint)(local_740._0_4_ * fVar170 * 1.9073486e-06)));
              auVar194._0_4_ = auVar65._0_4_ * fVar174;
              auVar194._4_4_ = auVar65._4_4_ * fVar174;
              auVar194._8_4_ = auVar65._8_4_ * fVar174;
              auVar194._12_4_ = auVar65._12_4_ * fVar174;
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar76 = vxorps_avx512vl(auVar68,auVar27);
              auVar77 = vmulps_avx512vl(auVar66,auVar194);
              auVar65 = vdpps_avx(auVar76,auVar69,0x7f);
              auVar66 = vfmadd213ss_fma(auVar73,ZEXT416((uint)fVar158),auVar72);
              auVar73 = vdpps_avx(auVar1,auVar77,0x7f);
              vfmadd213ss_avx512f(auVar71,ZEXT416((uint)(fVar158 / fVar173)),auVar66);
              fVar174 = auVar65._0_4_ + auVar73._0_4_;
              auVar65 = vdpps_avx(local_990,auVar69,0x7f);
              auVar73 = vdpps_avx(auVar1,auVar76,0x7f);
              auVar69 = vmulss_avx512f(auVar75,auVar70);
              auVar66 = vmulss_avx512f(auVar70,auVar70);
              auVar70 = vaddss_avx512f(auVar74,ZEXT416((uint)(auVar69._0_4_ * auVar66._0_4_)));
              auVar69 = vdpps_avx(auVar1,local_990,0x7f);
              auVar71 = vfnmadd231ss_avx512f(auVar73,local_9c0._0_16_,ZEXT416((uint)fVar174));
              auVar69 = vfnmadd231ss_avx512f(auVar69,local_9c0._0_16_,auVar65);
              auVar73 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar172 = fVar172 - auVar73._0_4_;
              auVar66 = vshufps_avx(auVar68,auVar68,0xff);
              auVar73 = vfmsub213ss_fma(auVar71,auVar70,auVar66);
              auVar234._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
              auVar234._8_4_ = auVar73._8_4_ ^ 0x80000000;
              auVar234._12_4_ = auVar73._12_4_ ^ 0x80000000;
              auVar69 = ZEXT416((uint)(auVar69._0_4_ * auVar70._0_4_));
              auVar70 = vfmsub231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar73._0_4_)),
                                        ZEXT416((uint)fVar174),auVar69);
              auVar73 = vinsertps_avx(auVar234,auVar69,0x1c);
              auVar225._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
              auVar225._8_4_ = auVar65._8_4_ ^ 0x80000000;
              auVar225._12_4_ = auVar65._12_4_ ^ 0x80000000;
              auVar69 = vinsertps_avx(ZEXT416((uint)fVar174),auVar225,0x10);
              auVar211._0_4_ = auVar70._0_4_;
              auVar211._4_4_ = auVar211._0_4_;
              auVar211._8_4_ = auVar211._0_4_;
              auVar211._12_4_ = auVar211._0_4_;
              auVar65 = vdivps_avx(auVar73,auVar211);
              auVar73 = vdivps_avx(auVar69,auVar211);
              auVar69 = vbroadcastss_avx512vl(local_9c0._0_16_);
              auVar212._0_4_ = auVar69._0_4_ * auVar65._0_4_ + fVar172 * auVar73._0_4_;
              auVar212._4_4_ = auVar69._4_4_ * auVar65._4_4_ + fVar172 * auVar73._4_4_;
              auVar212._8_4_ = auVar69._8_4_ * auVar65._8_4_ + fVar172 * auVar73._8_4_;
              auVar212._12_4_ = auVar69._12_4_ * auVar65._12_4_ + fVar172 * auVar73._12_4_;
              auVar65 = vsubps_avx(local_740._0_16_,auVar212);
              auVar221 = ZEXT1664(auVar65);
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar73 = vandps_avx512vl(local_9c0._0_16_,auVar28);
              auVar73 = vucomiss_avx512f(auVar73);
              if (!(bool)uVar59 && !(bool)uVar61) {
                auVar73 = vaddss_avx512f(auVar72,auVar73);
                auVar73 = vfmadd231ss_fma(auVar73,local_940,ZEXT416(0x36000000));
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar69 = vandps_avx512vl(ZEXT416((uint)fVar172),auVar29);
                if (auVar69._0_4_ < auVar73._0_4_) {
                  fVar170 = auVar65._0_4_ + (float)local_950._0_4_;
                  auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar170 < fVar203) {
                    bVar57 = 0;
                    goto LAB_01cea18e;
                  }
                  fVar172 = *(float *)(ray + k * 4 + 0x200);
                  if (fVar172 < fVar170) {
                    bVar57 = 0;
                    goto LAB_01cea18e;
                  }
                  auVar65 = vmovshdup_avx(auVar65);
                  bVar57 = 0;
                  if ((auVar65._0_4_ < 0.0) || (1.0 < auVar65._0_4_)) goto LAB_01cea18e;
                  auVar213._0_12_ = ZEXT812(0);
                  auVar213._12_4_ = 0;
                  auVar195._4_8_ = auVar213._4_8_;
                  auVar195._0_4_ = fVar171;
                  auVar195._12_4_ = 0;
                  auVar65 = vrsqrt14ss_avx512f(auVar213,auVar195);
                  fVar174 = auVar65._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar58].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                    bVar57 = 0;
                    goto LAB_01cea18e;
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar57 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01cea18e;
                  fVar171 = fVar174 * 1.5 + fVar171 * -0.5 * fVar174 * fVar174 * fVar174;
                  auVar196._0_4_ = auVar1._0_4_ * fVar171;
                  auVar196._4_4_ = auVar1._4_4_ * fVar171;
                  auVar196._8_4_ = auVar1._8_4_ * fVar171;
                  auVar196._12_4_ = auVar1._12_4_ * fVar171;
                  auVar73 = vfmadd213ps_fma(auVar66,auVar196,auVar68);
                  auVar65 = vshufps_avx(auVar196,auVar196,0xc9);
                  auVar1 = vshufps_avx(auVar68,auVar68,0xc9);
                  auVar197._0_4_ = auVar196._0_4_ * auVar1._0_4_;
                  auVar197._4_4_ = auVar196._4_4_ * auVar1._4_4_;
                  auVar197._8_4_ = auVar196._8_4_ * auVar1._8_4_;
                  auVar197._12_4_ = auVar196._12_4_ * auVar1._12_4_;
                  auVar68 = vfmsub231ps_fma(auVar197,auVar68,auVar65);
                  auVar65 = vshufps_avx(auVar68,auVar68,0xc9);
                  auVar1 = vshufps_avx(auVar73,auVar73,0xc9);
                  auVar68 = vshufps_avx(auVar68,auVar68,0xd2);
                  auVar150._0_4_ = auVar73._0_4_ * auVar68._0_4_;
                  auVar150._4_4_ = auVar73._4_4_ * auVar68._4_4_;
                  auVar150._8_4_ = auVar73._8_4_ * auVar68._8_4_;
                  auVar150._12_4_ = auVar73._12_4_ * auVar68._12_4_;
                  auVar65 = vfmsub231ps_fma(auVar150,auVar65,auVar1);
                  auVar133 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar133,auVar221);
                  auVar221 = vpermps_avx512f(auVar133,ZEXT1664(auVar65));
                  auVar133 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar133,ZEXT1664(auVar65));
                  local_380 = vbroadcastss_avx512f(auVar65);
                  local_400[0] = (RTCHitN)auVar221[0];
                  local_400[1] = (RTCHitN)auVar221[1];
                  local_400[2] = (RTCHitN)auVar221[2];
                  local_400[3] = (RTCHitN)auVar221[3];
                  local_400[4] = (RTCHitN)auVar221[4];
                  local_400[5] = (RTCHitN)auVar221[5];
                  local_400[6] = (RTCHitN)auVar221[6];
                  local_400[7] = (RTCHitN)auVar221[7];
                  local_400[8] = (RTCHitN)auVar221[8];
                  local_400[9] = (RTCHitN)auVar221[9];
                  local_400[10] = (RTCHitN)auVar221[10];
                  local_400[0xb] = (RTCHitN)auVar221[0xb];
                  local_400[0xc] = (RTCHitN)auVar221[0xc];
                  local_400[0xd] = (RTCHitN)auVar221[0xd];
                  local_400[0xe] = (RTCHitN)auVar221[0xe];
                  local_400[0xf] = (RTCHitN)auVar221[0xf];
                  local_400[0x10] = (RTCHitN)auVar221[0x10];
                  local_400[0x11] = (RTCHitN)auVar221[0x11];
                  local_400[0x12] = (RTCHitN)auVar221[0x12];
                  local_400[0x13] = (RTCHitN)auVar221[0x13];
                  local_400[0x14] = (RTCHitN)auVar221[0x14];
                  local_400[0x15] = (RTCHitN)auVar221[0x15];
                  local_400[0x16] = (RTCHitN)auVar221[0x16];
                  local_400[0x17] = (RTCHitN)auVar221[0x17];
                  local_400[0x18] = (RTCHitN)auVar221[0x18];
                  local_400[0x19] = (RTCHitN)auVar221[0x19];
                  local_400[0x1a] = (RTCHitN)auVar221[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar221[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar221[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar221[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar221[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar221[0x1f];
                  local_400[0x20] = (RTCHitN)auVar221[0x20];
                  local_400[0x21] = (RTCHitN)auVar221[0x21];
                  local_400[0x22] = (RTCHitN)auVar221[0x22];
                  local_400[0x23] = (RTCHitN)auVar221[0x23];
                  local_400[0x24] = (RTCHitN)auVar221[0x24];
                  local_400[0x25] = (RTCHitN)auVar221[0x25];
                  local_400[0x26] = (RTCHitN)auVar221[0x26];
                  local_400[0x27] = (RTCHitN)auVar221[0x27];
                  local_400[0x28] = (RTCHitN)auVar221[0x28];
                  local_400[0x29] = (RTCHitN)auVar221[0x29];
                  local_400[0x2a] = (RTCHitN)auVar221[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar221[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar221[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar221[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar221[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar221[0x2f];
                  local_400[0x30] = (RTCHitN)auVar221[0x30];
                  local_400[0x31] = (RTCHitN)auVar221[0x31];
                  local_400[0x32] = (RTCHitN)auVar221[0x32];
                  local_400[0x33] = (RTCHitN)auVar221[0x33];
                  local_400[0x34] = (RTCHitN)auVar221[0x34];
                  local_400[0x35] = (RTCHitN)auVar221[0x35];
                  local_400[0x36] = (RTCHitN)auVar221[0x36];
                  local_400[0x37] = (RTCHitN)auVar221[0x37];
                  local_400[0x38] = (RTCHitN)auVar221[0x38];
                  local_400[0x39] = (RTCHitN)auVar221[0x39];
                  local_400[0x3a] = (RTCHitN)auVar221[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar221[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar221[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar221[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar221[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar221[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar221 = vmovdqa64_avx512f(local_4c0);
                  local_280 = vmovdqa64_avx512f(auVar221);
                  vpcmpeqd_avx2(auVar221._0_32_,auVar221._0_32_);
                  local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar170;
                  auVar221 = vmovdqa64_avx512f(local_500);
                  local_700 = vmovdqa64_avx512f(auVar221);
                  local_9f0.valid = (int *)local_700;
                  local_9f0.geometryUserPtr = pGVar3->userPtr;
                  local_9f0.context = context->user;
                  local_9f0.hit = local_400;
                  local_9f0.N = 0x10;
                  local_9f0.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar3->occlusionFilterN)(&local_9f0);
                    auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    auVar221 = vmovdqa64_avx512f(local_700);
                  }
                  uVar16 = vptestmd_avx512f(auVar221,auVar221);
                  if ((short)uVar16 != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var5)(&local_9f0);
                      auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      auVar221 = vmovdqa64_avx512f(local_700);
                    }
                    uVar62 = vptestmd_avx512f(auVar221,auVar221);
                    auVar221 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar6 = (bool)((byte)uVar62 & 1);
                    auVar134._0_4_ =
                         (uint)bVar6 * auVar221._0_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x200);
                    bVar6 = (bool)((byte)(uVar62 >> 1) & 1);
                    auVar134._4_4_ =
                         (uint)bVar6 * auVar221._4_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x204);
                    bVar6 = (bool)((byte)(uVar62 >> 2) & 1);
                    auVar134._8_4_ =
                         (uint)bVar6 * auVar221._8_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x208);
                    bVar6 = (bool)((byte)(uVar62 >> 3) & 1);
                    auVar134._12_4_ =
                         (uint)bVar6 * auVar221._12_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x20c);
                    bVar6 = (bool)((byte)(uVar62 >> 4) & 1);
                    auVar134._16_4_ =
                         (uint)bVar6 * auVar221._16_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x210);
                    bVar6 = (bool)((byte)(uVar62 >> 5) & 1);
                    auVar134._20_4_ =
                         (uint)bVar6 * auVar221._20_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x214);
                    bVar6 = (bool)((byte)(uVar62 >> 6) & 1);
                    auVar134._24_4_ =
                         (uint)bVar6 * auVar221._24_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x218);
                    bVar6 = (bool)((byte)(uVar62 >> 7) & 1);
                    auVar134._28_4_ =
                         (uint)bVar6 * auVar221._28_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x21c);
                    bVar6 = (bool)((byte)(uVar62 >> 8) & 1);
                    auVar134._32_4_ =
                         (uint)bVar6 * auVar221._32_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x220);
                    bVar6 = (bool)((byte)(uVar62 >> 9) & 1);
                    auVar134._36_4_ =
                         (uint)bVar6 * auVar221._36_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x224);
                    bVar6 = (bool)((byte)(uVar62 >> 10) & 1);
                    auVar134._40_4_ =
                         (uint)bVar6 * auVar221._40_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x228);
                    bVar6 = (bool)((byte)(uVar62 >> 0xb) & 1);
                    auVar134._44_4_ =
                         (uint)bVar6 * auVar221._44_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x22c);
                    bVar6 = (bool)((byte)(uVar62 >> 0xc) & 1);
                    auVar134._48_4_ =
                         (uint)bVar6 * auVar221._48_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x230);
                    bVar6 = (bool)((byte)(uVar62 >> 0xd) & 1);
                    auVar134._52_4_ =
                         (uint)bVar6 * auVar221._52_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x234);
                    bVar6 = (bool)((byte)(uVar62 >> 0xe) & 1);
                    auVar134._56_4_ =
                         (uint)bVar6 * auVar221._56_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x238);
                    bVar6 = SUB81(uVar62 >> 0xf,0);
                    auVar134._60_4_ =
                         (uint)bVar6 * auVar221._60_4_ |
                         (uint)!bVar6 * *(int *)(local_9f0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_9f0.ray + 0x200) = auVar134;
                    bVar57 = 1;
                    if ((short)uVar62 != 0) goto LAB_01cea18e;
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar172;
                  bVar57 = 0;
                  goto LAB_01cea18e;
                }
              }
              bVar60 = uVar62 < 4;
              uVar62 = uVar62 + 1;
            } while (uVar62 != 5);
            bVar60 = false;
            auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar57 = 5;
LAB_01cea18e:
            bVar56 = (bool)(bVar56 | bVar60 & bVar57);
            uVar143 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar154._4_4_ = uVar143;
            auVar154._0_4_ = uVar143;
            auVar154._8_4_ = uVar143;
            auVar154._12_4_ = uVar143;
            auVar154._16_4_ = uVar143;
            auVar154._20_4_ = uVar143;
            auVar154._24_4_ = uVar143;
            auVar154._28_4_ = uVar143;
            auVar46._4_4_ = fStack_69c;
            auVar46._0_4_ = local_6a0;
            auVar46._8_4_ = fStack_698;
            auVar46._12_4_ = fStack_694;
            auVar46._16_4_ = fStack_690;
            auVar46._20_4_ = fStack_68c;
            auVar46._24_4_ = fStack_688;
            auVar46._28_4_ = fStack_684;
            uVar16 = vcmpps_avx512vl(auVar154,auVar46,0xd);
            bVar54 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar54 & (byte)uVar16;
            auVar130 = local_6c0;
          } while (bVar54 != 0);
        }
        auVar221 = ZEXT3264(local_8e0);
        uVar17 = vpcmpgtd_avx512vl(auVar130,local_680);
        uVar18 = vpcmpd_avx512vl(local_680,local_600,1);
        auVar200._0_4_ = fVar142 + (float)local_440._0_4_;
        auVar200._4_4_ = fVar142 + (float)local_440._4_4_;
        auVar200._8_4_ = fVar142 + fStack_438;
        auVar200._12_4_ = fVar142 + fStack_434;
        auVar200._16_4_ = fVar142 + fStack_430;
        auVar200._20_4_ = fVar142 + fStack_42c;
        auVar200._24_4_ = fVar142 + fStack_428;
        auVar200._28_4_ = fVar142 + fStack_424;
        uVar16 = vcmpps_avx512vl(auVar200,auVar154,2);
        bVar55 = bVar55 & (byte)uVar18 & (byte)uVar16;
        auVar201._0_4_ = fVar142 + local_660._0_4_;
        auVar201._4_4_ = fVar142 + local_660._4_4_;
        auVar201._8_4_ = fVar142 + local_660._8_4_;
        auVar201._12_4_ = fVar142 + local_660._12_4_;
        auVar201._16_4_ = fVar142 + local_660._16_4_;
        auVar201._20_4_ = fVar142 + local_660._20_4_;
        auVar201._24_4_ = fVar142 + local_660._24_4_;
        auVar201._28_4_ = fVar142 + local_660._28_4_;
        uVar16 = vcmpps_avx512vl(auVar201,auVar154,2);
        bVar48 = bVar48 & (byte)uVar17 & (byte)uVar16 | bVar55;
        prim = local_8f0;
        if (bVar48 != 0) {
          abStack_1a0[uVar52 * 0x60] = bVar48;
          auVar132._0_4_ =
               (uint)(bVar55 & 1) * local_440._0_4_ |
               (uint)!(bool)(bVar55 & 1) * (int)local_660._0_4_;
          bVar60 = (bool)(bVar55 >> 1 & 1);
          auVar132._4_4_ = (uint)bVar60 * local_440._4_4_ | (uint)!bVar60 * (int)local_660._4_4_;
          bVar60 = (bool)(bVar55 >> 2 & 1);
          auVar132._8_4_ = (uint)bVar60 * (int)fStack_438 | (uint)!bVar60 * (int)local_660._8_4_;
          bVar60 = (bool)(bVar55 >> 3 & 1);
          auVar132._12_4_ = (uint)bVar60 * (int)fStack_434 | (uint)!bVar60 * (int)local_660._12_4_;
          bVar60 = (bool)(bVar55 >> 4 & 1);
          auVar132._16_4_ = (uint)bVar60 * (int)fStack_430 | (uint)!bVar60 * (int)local_660._16_4_;
          bVar60 = (bool)(bVar55 >> 5 & 1);
          auVar132._20_4_ = (uint)bVar60 * (int)fStack_42c | (uint)!bVar60 * (int)local_660._20_4_;
          auVar132._24_4_ =
               (uint)(bVar55 >> 6) * (int)fStack_428 |
               (uint)!(bool)(bVar55 >> 6) * (int)local_660._24_4_;
          auVar132._28_4_ = local_660._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar52 * 0x60) = auVar132;
          uVar62 = vmovlps_avx(local_960);
          (&uStack_160)[uVar52 * 0xc] = uVar62;
          aiStack_158[uVar52 * 0x18] = local_cb4 + 1;
          uVar52 = (ulong)((int)uVar52 + 1);
        }
      }
    }
    do {
      uVar64 = (uint)uVar52;
      uVar52 = (ulong)(uVar64 - 1);
      if (uVar64 == 0) {
        if (bVar56 != false) {
          return bVar56;
        }
        uVar143 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar35._4_4_ = uVar143;
        auVar35._0_4_ = uVar143;
        auVar35._8_4_ = uVar143;
        auVar35._12_4_ = uVar143;
        auVar35._16_4_ = uVar143;
        auVar35._20_4_ = uVar143;
        auVar35._24_4_ = uVar143;
        auVar35._28_4_ = uVar143;
        uVar16 = vcmpps_avx512vl(local_5e0,auVar35,2);
        uVar58 = (uint)uVar16 & (uint)local_8e8 - 1 & (uint)local_8e8;
        local_8e8 = (ulong)uVar58;
        if (uVar58 == 0) {
          return false;
        }
        goto LAB_01ce79df;
      }
      lVar53 = uVar52 * 0x60;
      auVar79 = *(undefined1 (*) [32])(auStack_180 + lVar53);
      auVar166._0_4_ = fVar142 + auVar79._0_4_;
      auVar166._4_4_ = fVar142 + auVar79._4_4_;
      auVar166._8_4_ = fVar142 + auVar79._8_4_;
      auVar166._12_4_ = fVar142 + auVar79._12_4_;
      auVar166._16_4_ = fVar142 + auVar79._16_4_;
      auVar166._20_4_ = fVar142 + auVar79._20_4_;
      auVar166._24_4_ = fVar142 + auVar79._24_4_;
      auVar166._28_4_ = fVar142 + auVar79._28_4_;
      uVar143 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar34._4_4_ = uVar143;
      auVar34._0_4_ = uVar143;
      auVar34._8_4_ = uVar143;
      auVar34._12_4_ = uVar143;
      auVar34._16_4_ = uVar143;
      auVar34._20_4_ = uVar143;
      auVar34._24_4_ = uVar143;
      auVar34._28_4_ = uVar143;
      uVar16 = vcmpps_avx512vl(auVar166,auVar34,2);
      uVar63 = (uint)uVar16 & (uint)abStack_1a0[lVar53];
    } while (uVar63 == 0);
    uVar62 = (&uStack_160)[uVar52 * 0xc];
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar62;
    auVar199._8_4_ = 0x7f800000;
    auVar199._0_8_ = 0x7f8000007f800000;
    auVar199._12_4_ = 0x7f800000;
    auVar199._16_4_ = 0x7f800000;
    auVar199._20_4_ = 0x7f800000;
    auVar199._24_4_ = 0x7f800000;
    auVar199._28_4_ = 0x7f800000;
    auVar92 = vblendmps_avx512vl(auVar199,auVar79);
    bVar48 = (byte)uVar63;
    auVar128._0_4_ =
         (uint)(bVar48 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar48 & 1) * (int)auVar79._0_4_;
    bVar60 = (bool)((byte)(uVar63 >> 1) & 1);
    auVar128._4_4_ = (uint)bVar60 * auVar92._4_4_ | (uint)!bVar60 * (int)auVar79._4_4_;
    bVar60 = (bool)((byte)(uVar63 >> 2) & 1);
    auVar128._8_4_ = (uint)bVar60 * auVar92._8_4_ | (uint)!bVar60 * (int)auVar79._8_4_;
    bVar60 = (bool)((byte)(uVar63 >> 3) & 1);
    auVar128._12_4_ = (uint)bVar60 * auVar92._12_4_ | (uint)!bVar60 * (int)auVar79._12_4_;
    bVar60 = (bool)((byte)(uVar63 >> 4) & 1);
    auVar128._16_4_ = (uint)bVar60 * auVar92._16_4_ | (uint)!bVar60 * (int)auVar79._16_4_;
    bVar60 = (bool)((byte)(uVar63 >> 5) & 1);
    auVar128._20_4_ = (uint)bVar60 * auVar92._20_4_ | (uint)!bVar60 * (int)auVar79._20_4_;
    bVar60 = (bool)((byte)(uVar63 >> 6) & 1);
    auVar128._24_4_ = (uint)bVar60 * auVar92._24_4_ | (uint)!bVar60 * (int)auVar79._24_4_;
    auVar128._28_4_ =
         (uVar63 >> 7) * auVar92._28_4_ | (uint)!SUB41(uVar63 >> 7,0) * (int)auVar79._28_4_;
    auVar79 = vshufps_avx(auVar128,auVar128,0xb1);
    auVar79 = vminps_avx(auVar128,auVar79);
    auVar92 = vshufpd_avx(auVar79,auVar79,5);
    auVar79 = vminps_avx(auVar79,auVar92);
    auVar92 = vpermpd_avx2(auVar79,0x4e);
    auVar79 = vminps_avx(auVar79,auVar92);
    uVar16 = vcmpps_avx512vl(auVar128,auVar79,0);
    bVar54 = (byte)uVar16 & bVar48;
    if (bVar54 != 0) {
      uVar63 = (uint)bVar54;
    }
    uVar135 = 0;
    for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
      uVar135 = uVar135 + 1;
    }
    local_cb4 = aiStack_158[uVar52 * 0x18];
    bVar48 = ~('\x01' << ((byte)uVar135 & 0x1f)) & bVar48;
    abStack_1a0[lVar53] = bVar48;
    if (bVar48 == 0) {
      uVar64 = uVar64 - 1;
    }
    uVar143 = (undefined4)uVar62;
    auVar151._4_4_ = uVar143;
    auVar151._0_4_ = uVar143;
    auVar151._8_4_ = uVar143;
    auVar151._12_4_ = uVar143;
    auVar151._16_4_ = uVar143;
    auVar151._20_4_ = uVar143;
    auVar151._24_4_ = uVar143;
    auVar151._28_4_ = uVar143;
    auVar65 = vmovshdup_avx(auVar159);
    auVar65 = vsubps_avx(auVar65,auVar159);
    auVar167._0_4_ = auVar65._0_4_;
    auVar167._4_4_ = auVar167._0_4_;
    auVar167._8_4_ = auVar167._0_4_;
    auVar167._12_4_ = auVar167._0_4_;
    auVar167._16_4_ = auVar167._0_4_;
    auVar167._20_4_ = auVar167._0_4_;
    auVar167._24_4_ = auVar167._0_4_;
    auVar167._28_4_ = auVar167._0_4_;
    auVar65 = vfmadd132ps_fma(auVar167,auVar151,_DAT_01faff20);
    auVar79 = ZEXT1632(auVar65);
    local_400[0] = (RTCHitN)auVar79[0];
    local_400[1] = (RTCHitN)auVar79[1];
    local_400[2] = (RTCHitN)auVar79[2];
    local_400[3] = (RTCHitN)auVar79[3];
    local_400[4] = (RTCHitN)auVar79[4];
    local_400[5] = (RTCHitN)auVar79[5];
    local_400[6] = (RTCHitN)auVar79[6];
    local_400[7] = (RTCHitN)auVar79[7];
    local_400[8] = (RTCHitN)auVar79[8];
    local_400[9] = (RTCHitN)auVar79[9];
    local_400[10] = (RTCHitN)auVar79[10];
    local_400[0xb] = (RTCHitN)auVar79[0xb];
    local_400[0xc] = (RTCHitN)auVar79[0xc];
    local_400[0xd] = (RTCHitN)auVar79[0xd];
    local_400[0xe] = (RTCHitN)auVar79[0xe];
    local_400[0xf] = (RTCHitN)auVar79[0xf];
    local_400[0x10] = (RTCHitN)auVar79[0x10];
    local_400[0x11] = (RTCHitN)auVar79[0x11];
    local_400[0x12] = (RTCHitN)auVar79[0x12];
    local_400[0x13] = (RTCHitN)auVar79[0x13];
    local_400[0x14] = (RTCHitN)auVar79[0x14];
    local_400[0x15] = (RTCHitN)auVar79[0x15];
    local_400[0x16] = (RTCHitN)auVar79[0x16];
    local_400[0x17] = (RTCHitN)auVar79[0x17];
    local_400[0x18] = (RTCHitN)auVar79[0x18];
    local_400[0x19] = (RTCHitN)auVar79[0x19];
    local_400[0x1a] = (RTCHitN)auVar79[0x1a];
    local_400[0x1b] = (RTCHitN)auVar79[0x1b];
    local_400[0x1c] = (RTCHitN)auVar79[0x1c];
    local_400[0x1d] = (RTCHitN)auVar79[0x1d];
    local_400[0x1e] = (RTCHitN)auVar79[0x1e];
    local_400[0x1f] = (RTCHitN)auVar79[0x1f];
    local_960._8_8_ = 0;
    local_960._0_8_ = *(ulong *)(local_400 + (ulong)uVar135 * 4);
    uVar52 = (ulong)uVar64;
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }